

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersector1<8>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [12];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  byte bVar67;
  byte bVar68;
  byte bVar69;
  ulong uVar70;
  byte bVar71;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  ulong uVar72;
  long lVar73;
  bool bVar74;
  ulong uVar75;
  uint uVar76;
  undefined1 auVar87 [16];
  uint uVar126;
  uint uVar127;
  uint uVar129;
  uint uVar130;
  uint uVar131;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  uint uVar128;
  uint uVar132;
  undefined1 auVar125 [32];
  float pp;
  float fVar133;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar134;
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar149 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 extraout_var [60];
  undefined1 auVar152 [64];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [64];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [64];
  float fVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar211 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar223 [32];
  undefined1 auVar222 [16];
  undefined1 auVar224 [64];
  undefined4 uVar226;
  undefined4 uVar227;
  undefined4 uVar228;
  float fVar229;
  undefined1 auVar225 [28];
  undefined4 uVar231;
  undefined4 uVar232;
  undefined4 uVar233;
  undefined1 auVar230 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_88c;
  ulong local_888;
  undefined1 local_880 [32];
  ulong local_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  ulong local_7c8;
  RTCFilterFunctionNArguments local_7c0;
  uint local_78c;
  uint local_788;
  undefined4 local_784;
  undefined1 local_780 [16];
  undefined8 local_770;
  float local_768;
  float local_764;
  undefined4 local_760;
  uint local_75c;
  uint local_758;
  uint local_754;
  uint local_750;
  Primitive *local_738;
  ulong local_730;
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar119 [32];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  PVar3 = prim[1];
  uVar70 = (ulong)(byte)PVar3;
  fVar206 = *(float *)(prim + uVar70 * 0x19 + 0x12);
  auVar84 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar70 * 0x19 + 6));
  fVar189 = fVar206 * auVar84._0_4_;
  fVar133 = fVar206 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar70 * 4 + 6);
  auVar91 = vpmovsxbd_avx2(auVar78);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar70 * 5 + 6);
  auVar93 = vpmovsxbd_avx2(auVar79);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar70 * 6 + 6);
  auVar94 = vpmovsxbd_avx2(auVar80);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar95 = vpmovsxbd_avx2(auVar81);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  auVar100 = vpmovsxbd_avx2(auVar77);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar96 = vcvtdq2ps_avx(auVar100);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + (uint)(byte)PVar3 * 0xc + uVar70 + 6);
  auVar92 = vpmovsxbd_avx2(auVar86);
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar75 = (ulong)(uint)((int)(uVar70 * 9) * 2);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar75 + 6);
  auVar97 = vpmovsxbd_avx2(auVar82);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar75 + uVar70 + 6);
  auVar98 = vpmovsxbd_avx2(auVar83);
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar72 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar72 + 6);
  auVar90 = vpmovsxbd_avx2(auVar85);
  auVar99 = vcvtdq2ps_avx(auVar90);
  auVar111._4_4_ = fVar133;
  auVar111._0_4_ = fVar133;
  auVar111._8_4_ = fVar133;
  auVar111._12_4_ = fVar133;
  auVar111._16_4_ = fVar133;
  auVar111._20_4_ = fVar133;
  auVar111._24_4_ = fVar133;
  auVar111._28_4_ = fVar133;
  auVar115._8_4_ = 1;
  auVar115._0_8_ = 0x100000001;
  auVar115._12_4_ = 1;
  auVar115._16_4_ = 1;
  auVar115._20_4_ = 1;
  auVar115._24_4_ = 1;
  auVar115._28_4_ = 1;
  auVar88 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar102 = ZEXT1632(CONCAT412(fVar206 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar206 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar206 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar133))));
  auVar101 = vpermps_avx2(auVar115,auVar102);
  auVar89 = vpermps_avx512vl(auVar88,auVar102);
  fVar133 = auVar89._0_4_;
  fVar212 = auVar89._4_4_;
  auVar102._4_4_ = fVar212 * auVar94._4_4_;
  auVar102._0_4_ = fVar133 * auVar94._0_4_;
  fVar213 = auVar89._8_4_;
  auVar102._8_4_ = fVar213 * auVar94._8_4_;
  fVar229 = auVar89._12_4_;
  auVar102._12_4_ = fVar229 * auVar94._12_4_;
  fVar134 = auVar89._16_4_;
  auVar102._16_4_ = fVar134 * auVar94._16_4_;
  fVar214 = auVar89._20_4_;
  auVar102._20_4_ = fVar214 * auVar94._20_4_;
  fVar215 = auVar89._24_4_;
  auVar102._24_4_ = fVar215 * auVar94._24_4_;
  auVar102._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar92._4_4_ * fVar212;
  auVar100._0_4_ = auVar92._0_4_ * fVar133;
  auVar100._8_4_ = auVar92._8_4_ * fVar213;
  auVar100._12_4_ = auVar92._12_4_ * fVar229;
  auVar100._16_4_ = auVar92._16_4_ * fVar134;
  auVar100._20_4_ = auVar92._20_4_ * fVar214;
  auVar100._24_4_ = auVar92._24_4_ * fVar215;
  auVar100._28_4_ = auVar90._28_4_;
  auVar90._4_4_ = auVar99._4_4_ * fVar212;
  auVar90._0_4_ = auVar99._0_4_ * fVar133;
  auVar90._8_4_ = auVar99._8_4_ * fVar213;
  auVar90._12_4_ = auVar99._12_4_ * fVar229;
  auVar90._16_4_ = auVar99._16_4_ * fVar134;
  auVar90._20_4_ = auVar99._20_4_ * fVar214;
  auVar90._24_4_ = auVar99._24_4_ * fVar215;
  auVar90._28_4_ = auVar89._28_4_;
  auVar78 = vfmadd231ps_fma(auVar102,auVar101,auVar93);
  auVar79 = vfmadd231ps_fma(auVar100,auVar101,auVar96);
  auVar80 = vfmadd231ps_fma(auVar90,auVar98,auVar101);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar111,auVar91);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar111,auVar95);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar97,auVar111);
  auVar112._4_4_ = fVar189;
  auVar112._0_4_ = fVar189;
  auVar112._8_4_ = fVar189;
  auVar112._12_4_ = fVar189;
  auVar112._16_4_ = fVar189;
  auVar112._20_4_ = fVar189;
  auVar112._24_4_ = fVar189;
  auVar112._28_4_ = fVar189;
  auVar90 = ZEXT1632(CONCAT412(fVar206 * auVar84._12_4_,
                               CONCAT48(fVar206 * auVar84._8_4_,
                                        CONCAT44(fVar206 * auVar84._4_4_,fVar189))));
  auVar100 = vpermps_avx2(auVar115,auVar90);
  auVar90 = vpermps_avx512vl(auVar88,auVar90);
  fVar206 = auVar90._0_4_;
  fVar133 = auVar90._4_4_;
  auVar101._4_4_ = fVar133 * auVar94._4_4_;
  auVar101._0_4_ = fVar206 * auVar94._0_4_;
  fVar212 = auVar90._8_4_;
  auVar101._8_4_ = fVar212 * auVar94._8_4_;
  fVar213 = auVar90._12_4_;
  auVar101._12_4_ = fVar213 * auVar94._12_4_;
  fVar229 = auVar90._16_4_;
  auVar101._16_4_ = fVar229 * auVar94._16_4_;
  fVar134 = auVar90._20_4_;
  auVar101._20_4_ = fVar134 * auVar94._20_4_;
  fVar214 = auVar90._24_4_;
  auVar101._24_4_ = fVar214 * auVar94._24_4_;
  auVar101._28_4_ = 1;
  auVar88._4_4_ = auVar92._4_4_ * fVar133;
  auVar88._0_4_ = auVar92._0_4_ * fVar206;
  auVar88._8_4_ = auVar92._8_4_ * fVar212;
  auVar88._12_4_ = auVar92._12_4_ * fVar213;
  auVar88._16_4_ = auVar92._16_4_ * fVar229;
  auVar88._20_4_ = auVar92._20_4_ * fVar134;
  auVar88._24_4_ = auVar92._24_4_ * fVar214;
  auVar88._28_4_ = auVar94._28_4_;
  auVar92._4_4_ = auVar99._4_4_ * fVar133;
  auVar92._0_4_ = auVar99._0_4_ * fVar206;
  auVar92._8_4_ = auVar99._8_4_ * fVar212;
  auVar92._12_4_ = auVar99._12_4_ * fVar213;
  auVar92._16_4_ = auVar99._16_4_ * fVar229;
  auVar92._20_4_ = auVar99._20_4_ * fVar134;
  auVar92._24_4_ = auVar99._24_4_ * fVar214;
  auVar92._28_4_ = auVar90._28_4_;
  auVar81 = vfmadd231ps_fma(auVar101,auVar100,auVar93);
  auVar77 = vfmadd231ps_fma(auVar88,auVar100,auVar96);
  auVar86 = vfmadd231ps_fma(auVar92,auVar100,auVar98);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar112,auVar91);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar112,auVar95);
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar112,auVar97);
  auVar91 = vandps_avx(ZEXT1632(auVar78),auVar108);
  auVar110._8_4_ = 0x219392ef;
  auVar110._0_8_ = 0x219392ef219392ef;
  auVar110._12_4_ = 0x219392ef;
  auVar110._16_4_ = 0x219392ef;
  auVar110._20_4_ = 0x219392ef;
  auVar110._24_4_ = 0x219392ef;
  auVar110._28_4_ = 0x219392ef;
  uVar75 = vcmpps_avx512vl(auVar91,auVar110,1);
  bVar6 = (bool)((byte)uVar75 & 1);
  auVar89._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar78._0_4_;
  bVar6 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar78._4_4_;
  bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar78._8_4_;
  bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar78._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(ZEXT1632(auVar79),auVar108);
  uVar75 = vcmpps_avx512vl(auVar91,auVar110,1);
  bVar6 = (bool)((byte)uVar75 & 1);
  auVar103._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar79._0_4_;
  bVar6 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar79._4_4_;
  bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar79._8_4_;
  bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar79._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(ZEXT1632(auVar80),auVar108);
  uVar75 = vcmpps_avx512vl(auVar91,auVar110,1);
  bVar6 = (bool)((byte)uVar75 & 1);
  auVar104._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar80._0_4_;
  bVar6 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar80._4_4_;
  bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar80._8_4_;
  bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar80._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar91 = vrcp14ps_avx512vl(auVar89);
  auVar109._8_4_ = 0x3f800000;
  auVar109._0_8_ = &DAT_3f8000003f800000;
  auVar109._12_4_ = 0x3f800000;
  auVar109._16_4_ = 0x3f800000;
  auVar109._20_4_ = 0x3f800000;
  auVar109._24_4_ = 0x3f800000;
  auVar109._28_4_ = 0x3f800000;
  auVar78 = vfnmadd213ps_fma(auVar89,auVar91,auVar109);
  auVar78 = vfmadd132ps_fma(ZEXT1632(auVar78),auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar103);
  auVar79 = vfnmadd213ps_fma(auVar103,auVar91,auVar109);
  auVar79 = vfmadd132ps_fma(ZEXT1632(auVar79),auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar104);
  auVar80 = vfnmadd213ps_fma(auVar104,auVar91,auVar109);
  auVar80 = vfmadd132ps_fma(ZEXT1632(auVar80),auVar91,auVar91);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 7 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar81));
  auVar97._4_4_ = auVar78._4_4_ * auVar91._4_4_;
  auVar97._0_4_ = auVar78._0_4_ * auVar91._0_4_;
  auVar97._8_4_ = auVar78._8_4_ * auVar91._8_4_;
  auVar97._12_4_ = auVar78._12_4_ * auVar91._12_4_;
  auVar97._16_4_ = auVar91._16_4_ * 0.0;
  auVar97._20_4_ = auVar91._20_4_ * 0.0;
  auVar97._24_4_ = auVar91._24_4_ * 0.0;
  auVar97._28_4_ = auVar91._28_4_;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 9 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar81));
  auVar92 = vpbroadcastd_avx512vl();
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar3 * 0x10 + 6));
  auVar107._0_4_ = auVar78._0_4_ * auVar91._0_4_;
  auVar107._4_4_ = auVar78._4_4_ * auVar91._4_4_;
  auVar107._8_4_ = auVar78._8_4_ * auVar91._8_4_;
  auVar107._12_4_ = auVar78._12_4_ * auVar91._12_4_;
  auVar107._16_4_ = auVar91._16_4_ * 0.0;
  auVar107._20_4_ = auVar91._20_4_ * 0.0;
  auVar107._24_4_ = auVar91._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar3 * 0x10 + uVar70 * -2 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar77));
  auVar98._4_4_ = auVar79._4_4_ * auVar91._4_4_;
  auVar98._0_4_ = auVar79._0_4_ * auVar91._0_4_;
  auVar98._8_4_ = auVar79._8_4_ * auVar91._8_4_;
  auVar98._12_4_ = auVar79._12_4_ * auVar91._12_4_;
  auVar98._16_4_ = auVar91._16_4_ * 0.0;
  auVar98._20_4_ = auVar91._20_4_ * 0.0;
  auVar98._24_4_ = auVar91._24_4_ * 0.0;
  auVar98._28_4_ = auVar91._28_4_;
  auVar91 = vcvtdq2ps_avx(auVar93);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar77));
  auVar106._0_4_ = auVar79._0_4_ * auVar91._0_4_;
  auVar106._4_4_ = auVar79._4_4_ * auVar91._4_4_;
  auVar106._8_4_ = auVar79._8_4_ * auVar91._8_4_;
  auVar106._12_4_ = auVar79._12_4_ * auVar91._12_4_;
  auVar106._16_4_ = auVar91._16_4_ * 0.0;
  auVar106._20_4_ = auVar91._20_4_ * 0.0;
  auVar106._24_4_ = auVar91._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 + uVar70 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar86));
  auVar99._4_4_ = auVar91._4_4_ * auVar80._4_4_;
  auVar99._0_4_ = auVar91._0_4_ * auVar80._0_4_;
  auVar99._8_4_ = auVar91._8_4_ * auVar80._8_4_;
  auVar99._12_4_ = auVar91._12_4_ * auVar80._12_4_;
  auVar99._16_4_ = auVar91._16_4_ * 0.0;
  auVar99._20_4_ = auVar91._20_4_ * 0.0;
  auVar99._24_4_ = auVar91._24_4_ * 0.0;
  auVar99._28_4_ = auVar91._28_4_;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x17 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar86));
  auVar105._0_4_ = auVar80._0_4_ * auVar91._0_4_;
  auVar105._4_4_ = auVar80._4_4_ * auVar91._4_4_;
  auVar105._8_4_ = auVar80._8_4_ * auVar91._8_4_;
  auVar105._12_4_ = auVar80._12_4_ * auVar91._12_4_;
  auVar105._16_4_ = auVar91._16_4_ * 0.0;
  auVar105._20_4_ = auVar91._20_4_ * 0.0;
  auVar105._24_4_ = auVar91._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar91 = vpminsd_avx2(auVar97,auVar107);
  auVar93 = vpminsd_avx2(auVar98,auVar106);
  auVar91 = vmaxps_avx(auVar91,auVar93);
  auVar93 = vpminsd_avx2(auVar99,auVar105);
  uVar226 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar94._4_4_ = uVar226;
  auVar94._0_4_ = uVar226;
  auVar94._8_4_ = uVar226;
  auVar94._12_4_ = uVar226;
  auVar94._16_4_ = uVar226;
  auVar94._20_4_ = uVar226;
  auVar94._24_4_ = uVar226;
  auVar94._28_4_ = uVar226;
  auVar93 = vmaxps_avx512vl(auVar93,auVar94);
  auVar91 = vmaxps_avx(auVar91,auVar93);
  auVar93._8_4_ = 0x3f7ffffa;
  auVar93._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar93._12_4_ = 0x3f7ffffa;
  auVar93._16_4_ = 0x3f7ffffa;
  auVar93._20_4_ = 0x3f7ffffa;
  auVar93._24_4_ = 0x3f7ffffa;
  auVar93._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar91,auVar93);
  auVar91 = vpmaxsd_avx2(auVar97,auVar107);
  auVar93 = vpmaxsd_avx2(auVar98,auVar106);
  auVar91 = vminps_avx(auVar91,auVar93);
  auVar93 = vpmaxsd_avx2(auVar99,auVar105);
  fVar206 = (ray->super_RayK<1>).tfar;
  auVar95._4_4_ = fVar206;
  auVar95._0_4_ = fVar206;
  auVar95._8_4_ = fVar206;
  auVar95._12_4_ = fVar206;
  auVar95._16_4_ = fVar206;
  auVar95._20_4_ = fVar206;
  auVar95._24_4_ = fVar206;
  auVar95._28_4_ = fVar206;
  auVar93 = vminps_avx512vl(auVar93,auVar95);
  auVar91 = vminps_avx(auVar91,auVar93);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar96._16_4_ = 0x3f800003;
  auVar96._20_4_ = 0x3f800003;
  auVar96._24_4_ = 0x3f800003;
  auVar96._28_4_ = 0x3f800003;
  auVar91 = vmulps_avx512vl(auVar91,auVar96);
  uVar15 = vpcmpgtd_avx512vl(auVar92,_DAT_0205a920);
  uVar14 = vcmpps_avx512vl(local_3c0,auVar91,2);
  if ((byte)((byte)uVar14 & (byte)uVar15) == 0) {
    return;
  }
  local_728 = (ulong)(byte)((byte)uVar14 & (byte)uVar15);
  auVar237 = ZEXT864(0) << 0x20;
  local_738 = prim;
LAB_01ddceb6:
  lVar73 = 0;
  for (uVar75 = local_728; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
    lVar73 = lVar73 + 1;
  }
  local_888 = (ulong)*(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_848 = (ulong)*(uint *)(prim + lVar73 * 4 + 6);
  uVar75 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar73 * 4 + 6));
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar73 = *(long *)&pGVar4[1].time_range.upper;
  auVar78 = *(undefined1 (*) [16])(lVar73 + (long)p_Var5 * uVar75);
  auVar79 = *(undefined1 (*) [16])(lVar73 + (uVar75 + 1) * (long)p_Var5);
  auVar80 = *(undefined1 (*) [16])(lVar73 + (uVar75 + 2) * (long)p_Var5);
  local_728 = local_728 - 1 & local_728;
  auVar81 = *(undefined1 (*) [16])(lVar73 + (uVar75 + 3) * (long)p_Var5);
  if (local_728 != 0) {
    uVar72 = local_728 - 1 & local_728;
    for (uVar75 = local_728; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
    }
    if (uVar72 != 0) {
      for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar87._0_4_ = auVar78._0_4_ + auVar79._0_4_ + auVar80._0_4_ + auVar81._0_4_;
  auVar87._4_4_ = auVar78._4_4_ + auVar79._4_4_ + auVar80._4_4_ + auVar81._4_4_;
  auVar87._8_4_ = auVar78._8_4_ + auVar79._8_4_ + auVar80._8_4_ + auVar81._8_4_;
  auVar87._12_4_ = auVar78._12_4_ + auVar79._12_4_ + auVar80._12_4_ + auVar81._12_4_;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar200 = ZEXT1664((undefined1  [16])aVar2);
  auVar84._8_4_ = 0x3e800000;
  auVar84._0_8_ = 0x3e8000003e800000;
  auVar84._12_4_ = 0x3e800000;
  local_480._16_16_ = auVar91._16_16_;
  auVar77 = vmulps_avx512vl(auVar87,auVar84);
  auVar77 = vsubps_avx(auVar77,(undefined1  [16])aVar1);
  auVar77 = vdpps_avx(auVar77,(undefined1  [16])aVar2,0x7f);
  auVar86 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar221._4_12_ = auVar237._4_12_;
  auVar221._0_4_ = auVar86._0_4_;
  local_480._0_16_ = vrcp14ss_avx512f(auVar237._0_16_,auVar221);
  auVar86 = vfnmadd213ss_fma(local_480._0_16_,auVar86,ZEXT416(0x40000000));
  fVar206 = auVar77._0_4_ * local_480._0_4_ * auVar86._0_4_;
  local_690 = ZEXT416((uint)fVar206);
  auVar216._4_4_ = fVar206;
  auVar216._0_4_ = fVar206;
  auVar216._8_4_ = fVar206;
  auVar216._12_4_ = fVar206;
  fStack_6d0 = fVar206;
  _local_6e0 = auVar216;
  fStack_6cc = fVar206;
  fStack_6c8 = fVar206;
  fStack_6c4 = fVar206;
  auVar77 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar216);
  auVar77 = vblendps_avx(auVar77,auVar237._0_16_,8);
  auVar78 = vsubps_avx(auVar78,auVar77);
  uVar226 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_520._4_4_ = uVar226;
  local_520._0_4_ = uVar226;
  local_520._8_4_ = uVar226;
  local_520._12_4_ = uVar226;
  local_520._16_4_ = uVar226;
  local_520._20_4_ = uVar226;
  local_520._24_4_ = uVar226;
  local_520._28_4_ = uVar226;
  auVar224 = ZEXT3264(local_520);
  auVar80 = vsubps_avx(auVar80,auVar77);
  uVar226 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_540._4_4_ = uVar226;
  local_540._0_4_ = uVar226;
  local_540._8_4_ = uVar226;
  local_540._12_4_ = uVar226;
  local_540._16_4_ = uVar226;
  local_540._20_4_ = uVar226;
  local_540._24_4_ = uVar226;
  local_540._28_4_ = uVar226;
  local_560 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  uStack_55c = local_560;
  uStack_558 = local_560;
  uStack_554 = local_560;
  uStack_550 = local_560;
  uStack_54c = local_560;
  uStack_548 = local_560;
  uStack_544 = local_560;
  auVar79 = vsubps_avx(auVar79,auVar77);
  auVar81 = vsubps_avx(auVar81,auVar77);
  local_1a0 = auVar78._0_4_;
  uStack_19c = local_1a0;
  uStack_198 = local_1a0;
  uStack_194 = local_1a0;
  uStack_190 = local_1a0;
  uStack_18c = local_1a0;
  uStack_188 = local_1a0;
  uStack_184 = local_1a0;
  auVar117._8_4_ = 1;
  auVar117._0_8_ = 0x100000001;
  auVar117._12_4_ = 1;
  auVar117._16_4_ = 1;
  auVar117._20_4_ = 1;
  auVar117._24_4_ = 1;
  auVar117._28_4_ = 1;
  local_5c0 = ZEXT1632(auVar78);
  local_1c0 = vpermps_avx2(auVar117,local_5c0);
  auVar118._8_4_ = 2;
  auVar118._0_8_ = 0x200000002;
  auVar118._12_4_ = 2;
  auVar118._16_4_ = 2;
  auVar118._20_4_ = 2;
  auVar118._24_4_ = 2;
  auVar118._28_4_ = 2;
  local_1e0 = vpermps_avx2(auVar118,local_5c0);
  auVar119._8_4_ = 4.2039e-45;
  auVar119._0_8_ = 0x300000003;
  auVar119._12_4_ = 4.2039e-45;
  auVar119._16_4_ = 4.2039e-45;
  auVar119._20_4_ = 4.2039e-45;
  auVar119._24_4_ = 4.2039e-45;
  auVar119._28_4_ = 4.2039e-45;
  local_200 = vpermps_avx2(auVar119,local_5c0);
  local_220 = auVar79._0_4_;
  fStack_21c = local_220;
  fStack_218 = local_220;
  fStack_214 = local_220;
  fStack_210 = local_220;
  fStack_20c = local_220;
  fStack_208 = local_220;
  fStack_204 = local_220;
  local_600 = ZEXT1632(auVar79);
  local_240 = vpermps_avx2(auVar117,local_600);
  local_260 = vpermps_avx2(auVar118,local_600);
  local_280 = vpermps_avx2(auVar119,local_600);
  local_2a0 = auVar80._0_4_;
  uStack_29c = local_2a0;
  uStack_298 = local_2a0;
  uStack_294 = local_2a0;
  uStack_290 = local_2a0;
  uStack_28c = local_2a0;
  uStack_288 = local_2a0;
  uStack_284 = local_2a0;
  local_5e0 = ZEXT1632(auVar80);
  local_2c0 = vpermps_avx2(auVar117,local_5e0);
  local_2e0 = vpermps_avx2(auVar118,local_5e0);
  local_300 = vpermps_avx2(auVar119,local_5e0);
  local_320 = auVar81._0_4_;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  _local_620 = ZEXT1632(auVar81);
  _local_340 = vpermps_avx2(auVar117,_local_620);
  _local_360 = vpermps_avx2(auVar118,_local_620);
  local_380 = vpermps_avx2(auVar119,_local_620);
  auVar91 = vpermps_avx2(auVar118,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                     CONCAT48(aVar2.z * aVar2.z,
                                                              CONCAT44(aVar2.y * aVar2.y,
                                                                       aVar2.x * aVar2.x)))));
  auVar78 = vfmadd231ps_fma(auVar91,local_540,local_540);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_520,local_520);
  local_3a0 = ZEXT1632(auVar78);
  auVar116._8_4_ = 0x7fffffff;
  auVar116._0_8_ = 0x7fffffff7fffffff;
  auVar116._12_4_ = 0x7fffffff;
  auVar116._16_4_ = 0x7fffffff;
  auVar116._20_4_ = 0x7fffffff;
  auVar116._24_4_ = 0x7fffffff;
  auVar116._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar78),auVar116);
  local_730 = 1;
  local_7c8 = 0;
  auVar193 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    auVar78 = vmovshdup_avx(auVar193._0_16_);
    fVar134 = auVar193._0_4_;
    fVar206 = auVar78._0_4_ - fVar134;
    fVar229 = fVar206 * 0.04761905;
    local_780 = auVar193._0_16_;
    local_880._4_4_ = fVar134;
    local_880._0_4_ = fVar134;
    local_880._8_4_ = fVar134;
    local_880._12_4_ = fVar134;
    local_880._16_4_ = fVar134;
    local_880._20_4_ = fVar134;
    local_880._24_4_ = fVar134;
    local_880._28_4_ = fVar134;
    local_700._4_4_ = fVar206;
    local_700._0_4_ = fVar206;
    local_700._8_4_ = fVar206;
    local_700._12_4_ = fVar206;
    local_700._16_4_ = fVar206;
    local_700._20_4_ = fVar206;
    local_700._24_4_ = fVar206;
    local_700._28_4_ = fVar206;
    auVar78 = vfmadd231ps_fma(local_880,local_700,_DAT_02020f20);
    auVar141._8_4_ = 0x3f800000;
    auVar141._0_8_ = &DAT_3f8000003f800000;
    auVar141._12_4_ = 0x3f800000;
    auVar141._16_4_ = 0x3f800000;
    auVar141._20_4_ = 0x3f800000;
    auVar141._24_4_ = 0x3f800000;
    auVar141._28_4_ = 0x3f800000;
    auVar91 = vsubps_avx(auVar141,ZEXT1632(auVar78));
    auVar65._4_4_ = fStack_21c;
    auVar65._0_4_ = local_220;
    auVar65._8_4_ = fStack_218;
    auVar65._12_4_ = fStack_214;
    auVar65._16_4_ = fStack_210;
    auVar65._20_4_ = fStack_20c;
    auVar65._24_4_ = fStack_208;
    auVar65._28_4_ = fStack_204;
    fVar206 = auVar78._0_4_;
    fVar133 = auVar78._4_4_;
    auVar58._4_4_ = fStack_21c * fVar133;
    auVar58._0_4_ = local_220 * fVar206;
    fVar212 = auVar78._8_4_;
    auVar58._8_4_ = fStack_218 * fVar212;
    fVar213 = auVar78._12_4_;
    auVar58._12_4_ = fStack_214 * fVar213;
    auVar58._16_4_ = fStack_210 * 0.0;
    auVar58._20_4_ = fStack_20c * 0.0;
    auVar58._24_4_ = fStack_208 * 0.0;
    auVar58._28_4_ = auVar119._28_4_;
    auVar237._0_4_ = local_240._0_4_ * fVar206;
    auVar237._4_4_ = local_240._4_4_ * fVar133;
    auVar237._8_4_ = local_240._8_4_ * fVar212;
    auVar237._12_4_ = local_240._12_4_ * fVar213;
    auVar237._16_4_ = local_240._16_4_ * 0.0;
    auVar237._20_4_ = local_240._20_4_ * 0.0;
    auVar237._28_36_ = auVar193._28_36_;
    auVar237._24_4_ = local_240._24_4_ * 0.0;
    auVar193._0_4_ = local_260._0_4_ * fVar206;
    auVar193._4_4_ = local_260._4_4_ * fVar133;
    auVar193._8_4_ = local_260._8_4_ * fVar212;
    auVar193._12_4_ = local_260._12_4_ * fVar213;
    auVar193._16_4_ = local_260._16_4_ * 0.0;
    auVar193._20_4_ = local_260._20_4_ * 0.0;
    auVar193._28_36_ = auVar200._28_36_;
    auVar193._24_4_ = local_260._24_4_ * 0.0;
    auVar200._0_4_ = local_280._0_4_ * fVar206;
    auVar200._4_4_ = local_280._4_4_ * fVar133;
    auVar200._8_4_ = local_280._8_4_ * fVar212;
    auVar200._12_4_ = local_280._12_4_ * fVar213;
    auVar200._16_4_ = local_280._16_4_ * 0.0;
    auVar200._20_4_ = local_280._20_4_ * 0.0;
    auVar200._28_36_ = auVar224._28_36_;
    auVar200._24_4_ = local_280._24_4_ * 0.0;
    auVar66._4_4_ = uStack_19c;
    auVar66._0_4_ = local_1a0;
    auVar66._8_4_ = uStack_198;
    auVar66._12_4_ = uStack_194;
    auVar66._16_4_ = uStack_190;
    auVar66._20_4_ = uStack_18c;
    auVar66._24_4_ = uStack_188;
    auVar66._28_4_ = uStack_184;
    auVar79 = vfmadd231ps_fma(auVar58,auVar91,auVar66);
    auVar80 = vfmadd231ps_fma(auVar237._0_32_,auVar91,local_1c0);
    auVar81 = vfmadd231ps_fma(auVar193._0_32_,auVar91,local_1e0);
    auVar77 = vfmadd231ps_fma(auVar200._0_32_,auVar91,local_200);
    auVar64._4_4_ = uStack_29c;
    auVar64._0_4_ = local_2a0;
    auVar64._8_4_ = uStack_298;
    auVar64._12_4_ = uStack_294;
    auVar64._16_4_ = uStack_290;
    auVar64._20_4_ = uStack_28c;
    auVar64._24_4_ = uStack_288;
    auVar64._28_4_ = uStack_284;
    auVar93 = vmulps_avx512vl(auVar64,ZEXT1632(auVar78));
    auVar99 = ZEXT1632(auVar78);
    auVar94 = vmulps_avx512vl(local_2c0,auVar99);
    auVar95 = vmulps_avx512vl(local_2e0,auVar99);
    auVar96 = vmulps_avx512vl(local_300,auVar99);
    auVar86 = vfmadd231ps_fma(auVar93,auVar91,auVar65);
    auVar82 = vfmadd231ps_fma(auVar94,auVar91,local_240);
    auVar83 = vfmadd231ps_fma(auVar95,auVar91,local_260);
    auVar85 = vfmadd231ps_fma(auVar96,auVar91,local_280);
    auVar39._4_4_ = fVar133 * fStack_31c;
    auVar39._0_4_ = fVar206 * local_320;
    auVar39._8_4_ = fVar212 * fStack_318;
    auVar39._12_4_ = fVar213 * fStack_314;
    auVar39._16_4_ = fStack_310 * 0.0;
    auVar39._20_4_ = fStack_30c * 0.0;
    auVar39._24_4_ = fStack_308 * 0.0;
    auVar39._28_4_ = local_240._28_4_;
    auVar40._4_4_ = fVar133 * (float)local_340._4_4_;
    auVar40._0_4_ = fVar206 * (float)local_340._0_4_;
    auVar40._8_4_ = fVar212 * fStack_338;
    auVar40._12_4_ = fVar213 * fStack_334;
    auVar40._16_4_ = fStack_330 * 0.0;
    auVar40._20_4_ = fStack_32c * 0.0;
    auVar40._24_4_ = fStack_328 * 0.0;
    auVar40._28_4_ = local_260._28_4_;
    auVar41._4_4_ = fVar133 * (float)local_360._4_4_;
    auVar41._0_4_ = fVar206 * (float)local_360._0_4_;
    auVar41._8_4_ = fVar212 * fStack_358;
    auVar41._12_4_ = fVar213 * fStack_354;
    auVar41._16_4_ = fStack_350 * 0.0;
    auVar41._20_4_ = fStack_34c * 0.0;
    auVar41._24_4_ = fStack_348 * 0.0;
    auVar41._28_4_ = local_280._28_4_;
    auVar93 = vmulps_avx512vl(auVar99,local_380);
    auVar94 = vfmadd231ps_avx512vl(auVar39,auVar91,auVar64);
    auVar95 = vfmadd231ps_avx512vl(auVar40,auVar91,local_2c0);
    auVar96 = vfmadd231ps_avx512vl(auVar41,auVar91,local_2e0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,local_300);
    auVar92 = vmulps_avx512vl(auVar99,ZEXT1632(auVar86));
    auVar97 = vmulps_avx512vl(auVar99,ZEXT1632(auVar82));
    auVar98 = vmulps_avx512vl(auVar99,ZEXT1632(auVar83));
    auVar99 = vmulps_avx512vl(auVar99,ZEXT1632(auVar85));
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar91,ZEXT1632(auVar79));
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar91,ZEXT1632(auVar80));
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar91,ZEXT1632(auVar81));
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar91,ZEXT1632(auVar77));
    auVar223._0_4_ = auVar94._0_4_ * fVar206;
    auVar223._4_4_ = auVar94._4_4_ * fVar133;
    auVar223._8_4_ = auVar94._8_4_ * fVar212;
    auVar223._12_4_ = auVar94._12_4_ * fVar213;
    auVar223._16_4_ = auVar94._16_4_ * 0.0;
    auVar223._20_4_ = auVar94._20_4_ * 0.0;
    auVar223._24_4_ = auVar94._24_4_ * 0.0;
    auVar223._28_4_ = 0;
    auVar42._4_4_ = auVar95._4_4_ * fVar133;
    auVar42._0_4_ = auVar95._0_4_ * fVar206;
    auVar42._8_4_ = auVar95._8_4_ * fVar212;
    auVar42._12_4_ = auVar95._12_4_ * fVar213;
    auVar42._16_4_ = auVar95._16_4_ * 0.0;
    auVar42._20_4_ = auVar95._20_4_ * 0.0;
    auVar42._24_4_ = auVar95._24_4_ * 0.0;
    auVar42._28_4_ = auVar94._28_4_;
    auVar43._4_4_ = auVar96._4_4_ * fVar133;
    auVar43._0_4_ = auVar96._0_4_ * fVar206;
    auVar43._8_4_ = auVar96._8_4_ * fVar212;
    auVar43._12_4_ = auVar96._12_4_ * fVar213;
    auVar43._16_4_ = auVar96._16_4_ * 0.0;
    auVar43._20_4_ = auVar96._20_4_ * 0.0;
    auVar43._24_4_ = auVar96._24_4_ * 0.0;
    auVar43._28_4_ = auVar95._28_4_;
    auVar93 = vmulps_avx512vl(ZEXT1632(auVar78),auVar93);
    auVar78 = vfmadd231ps_fma(auVar223,auVar91,ZEXT1632(auVar86));
    auVar79 = vfmadd231ps_fma(auVar42,auVar91,ZEXT1632(auVar82));
    auVar80 = vfmadd231ps_fma(auVar43,auVar91,ZEXT1632(auVar83));
    auVar81 = vfmadd231ps_fma(auVar93,auVar91,ZEXT1632(auVar85));
    auVar100 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar78._12_4_ * fVar213,
                                             CONCAT48(auVar78._8_4_ * fVar212,
                                                      CONCAT44(auVar78._4_4_ * fVar133,
                                                               auVar78._0_4_ * fVar206)))),auVar91,
                          auVar92);
    auVar200 = ZEXT3264(auVar100);
    auVar90 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar79._12_4_ * fVar213,
                                            CONCAT48(auVar79._8_4_ * fVar212,
                                                     CONCAT44(auVar79._4_4_ * fVar133,
                                                              auVar79._0_4_ * fVar206)))),auVar91,
                         auVar97);
    auVar101 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar80._12_4_ * fVar213,
                                             CONCAT48(auVar80._8_4_ * fVar212,
                                                      CONCAT44(auVar80._4_4_ * fVar133,
                                                               auVar80._0_4_ * fVar206)))),auVar91,
                          auVar98);
    auVar94 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar81._12_4_ * fVar213,
                                            CONCAT48(auVar81._8_4_ * fVar212,
                                                     CONCAT44(auVar81._4_4_ * fVar133,
                                                              auVar81._0_4_ * fVar206)))),auVar99,
                         auVar91);
    auVar91 = vsubps_avx512vl(ZEXT1632(auVar78),auVar92);
    auVar93 = vsubps_avx512vl(ZEXT1632(auVar79),auVar97);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar80),auVar98);
    auVar96 = vsubps_avx512vl(ZEXT1632(auVar81),auVar99);
    auVar234._0_4_ = fVar229 * auVar91._0_4_ * 3.0;
    auVar234._4_4_ = fVar229 * auVar91._4_4_ * 3.0;
    auVar234._8_4_ = fVar229 * auVar91._8_4_ * 3.0;
    auVar234._12_4_ = fVar229 * auVar91._12_4_ * 3.0;
    auVar234._16_4_ = fVar229 * auVar91._16_4_ * 3.0;
    auVar234._20_4_ = fVar229 * auVar91._20_4_ * 3.0;
    auVar234._24_4_ = fVar229 * auVar91._24_4_ * 3.0;
    auVar234._28_4_ = 0;
    auVar236._0_4_ = auVar93._0_4_ * 3.0 * fVar229;
    auVar236._4_4_ = auVar93._4_4_ * 3.0 * fVar229;
    auVar236._8_4_ = auVar93._8_4_ * 3.0 * fVar229;
    auVar236._12_4_ = auVar93._12_4_ * 3.0 * fVar229;
    auVar236._16_4_ = auVar93._16_4_ * 3.0 * fVar229;
    auVar236._20_4_ = auVar93._20_4_ * 3.0 * fVar229;
    auVar236._24_4_ = auVar93._24_4_ * 3.0 * fVar229;
    auVar236._28_4_ = 0;
    auVar239._0_4_ = auVar95._0_4_ * 3.0 * fVar229;
    auVar239._4_4_ = auVar95._4_4_ * 3.0 * fVar229;
    auVar239._8_4_ = auVar95._8_4_ * 3.0 * fVar229;
    auVar239._12_4_ = auVar95._12_4_ * 3.0 * fVar229;
    auVar239._16_4_ = auVar95._16_4_ * 3.0 * fVar229;
    auVar239._20_4_ = auVar95._20_4_ * 3.0 * fVar229;
    auVar239._24_4_ = auVar95._24_4_ * 3.0 * fVar229;
    auVar239._28_4_ = 0;
    fVar206 = auVar96._0_4_ * 3.0 * fVar229;
    fVar133 = auVar96._4_4_ * 3.0 * fVar229;
    auVar44._4_4_ = fVar133;
    auVar44._0_4_ = fVar206;
    fVar212 = auVar96._8_4_ * 3.0 * fVar229;
    auVar44._8_4_ = fVar212;
    fVar213 = auVar96._12_4_ * 3.0 * fVar229;
    auVar44._12_4_ = fVar213;
    fVar214 = auVar96._16_4_ * 3.0 * fVar229;
    auVar44._16_4_ = fVar214;
    fVar215 = auVar96._20_4_ * 3.0 * fVar229;
    auVar44._20_4_ = fVar215;
    fVar189 = auVar96._24_4_ * 3.0 * fVar229;
    auVar44._24_4_ = fVar189;
    auVar44._28_4_ = fVar229;
    auVar78 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar92 = vpermt2ps_avx512vl(auVar100,_DAT_0205fd20,ZEXT1632(auVar78));
    auVar224 = ZEXT3264(auVar92);
    auVar97 = vpermt2ps_avx512vl(auVar90,_DAT_0205fd20,ZEXT1632(auVar78));
    auVar95 = ZEXT1632(auVar78);
    auVar98 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,auVar95);
    auVar217._0_4_ = auVar94._0_4_ + fVar206;
    auVar217._4_4_ = auVar94._4_4_ + fVar133;
    auVar217._8_4_ = auVar94._8_4_ + fVar212;
    auVar217._12_4_ = auVar94._12_4_ + fVar213;
    auVar217._16_4_ = auVar94._16_4_ + fVar214;
    auVar217._20_4_ = auVar94._20_4_ + fVar215;
    auVar217._24_4_ = auVar94._24_4_ + fVar189;
    auVar217._28_4_ = auVar94._28_4_ + fVar229;
    auVar91 = vmaxps_avx(auVar94,auVar217);
    auVar93 = vminps_avx(auVar94,auVar217);
    auVar99 = vpermt2ps_avx512vl(auVar94,_DAT_0205fd20,auVar95);
    auVar102 = vpermt2ps_avx512vl(auVar234,_DAT_0205fd20,auVar95);
    auVar88 = vpermt2ps_avx512vl(auVar236,_DAT_0205fd20,auVar95);
    auVar111 = ZEXT1632(auVar78);
    auVar89 = vpermt2ps_avx512vl(auVar239,_DAT_0205fd20,auVar111);
    auVar94 = vpermt2ps_avx512vl(auVar44,_DAT_0205fd20,auVar111);
    auVar103 = vsubps_avx512vl(auVar99,auVar94);
    auVar94 = vsubps_avx(auVar92,auVar100);
    auVar95 = vsubps_avx(auVar97,auVar90);
    auVar96 = vsubps_avx(auVar98,auVar101);
    auVar104 = vmulps_avx512vl(auVar95,auVar239);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar236,auVar96);
    auVar105 = vmulps_avx512vl(auVar96,auVar234);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar239,auVar94);
    auVar106 = vmulps_avx512vl(auVar94,auVar236);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar234,auVar95);
    auVar106 = vmulps_avx512vl(auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar105 = vmulps_avx512vl(auVar96,auVar96);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar95,auVar95);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar94,auVar94);
    auVar106 = vrcp14ps_avx512vl(auVar105);
    auVar107 = vfnmadd213ps_avx512vl(auVar106,auVar105,auVar141);
    auVar106 = vfmadd132ps_avx512vl(auVar107,auVar106,auVar106);
    auVar104 = vmulps_avx512vl(auVar104,auVar106);
    auVar107 = vmulps_avx512vl(auVar95,auVar89);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar88,auVar96);
    auVar108 = vmulps_avx512vl(auVar96,auVar102);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar89,auVar94);
    auVar109 = vmulps_avx512vl(auVar94,auVar88);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar102,auVar95);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vmulps_avx512vl(auVar107,auVar106);
    auVar104 = vmaxps_avx512vl(auVar104,auVar106);
    auVar104 = vsqrtps_avx512vl(auVar104);
    auVar106 = vmaxps_avx512vl(auVar103,auVar99);
    auVar91 = vmaxps_avx512vl(auVar91,auVar106);
    auVar91 = vaddps_avx512vl(auVar104,auVar91);
    auVar99 = vminps_avx512vl(auVar103,auVar99);
    auVar93 = vminps_avx512vl(auVar93,auVar99);
    auVar93 = vsubps_avx512vl(auVar93,auVar104);
    auVar24._8_4_ = 0x3f800002;
    auVar24._0_8_ = 0x3f8000023f800002;
    auVar24._12_4_ = 0x3f800002;
    auVar24._16_4_ = 0x3f800002;
    auVar24._20_4_ = 0x3f800002;
    auVar24._24_4_ = 0x3f800002;
    auVar24._28_4_ = 0x3f800002;
    auVar91 = vmulps_avx512vl(auVar91,auVar24);
    auVar25._8_4_ = 0x3f7ffffc;
    auVar25._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar25._12_4_ = 0x3f7ffffc;
    auVar25._16_4_ = 0x3f7ffffc;
    auVar25._20_4_ = 0x3f7ffffc;
    auVar25._24_4_ = 0x3f7ffffc;
    auVar25._28_4_ = 0x3f7ffffc;
    local_720 = vmulps_avx512vl(auVar93,auVar25);
    auVar91 = vmulps_avx512vl(auVar91,auVar91);
    auVar93 = vrsqrt14ps_avx512vl(auVar105);
    auVar26._8_4_ = 0xbf000000;
    auVar26._0_8_ = 0xbf000000bf000000;
    auVar26._12_4_ = 0xbf000000;
    auVar26._16_4_ = 0xbf000000;
    auVar26._20_4_ = 0xbf000000;
    auVar26._24_4_ = 0xbf000000;
    auVar26._28_4_ = 0xbf000000;
    auVar99 = vmulps_avx512vl(auVar105,auVar26);
    auVar45._4_4_ = auVar93._4_4_ * auVar99._4_4_;
    auVar45._0_4_ = auVar93._0_4_ * auVar99._0_4_;
    auVar45._8_4_ = auVar93._8_4_ * auVar99._8_4_;
    auVar45._12_4_ = auVar93._12_4_ * auVar99._12_4_;
    auVar45._16_4_ = auVar93._16_4_ * auVar99._16_4_;
    auVar45._20_4_ = auVar93._20_4_ * auVar99._20_4_;
    auVar45._24_4_ = auVar93._24_4_ * auVar99._24_4_;
    auVar45._28_4_ = auVar99._28_4_;
    auVar99 = vmulps_avx512vl(auVar93,auVar93);
    auVar99 = vmulps_avx512vl(auVar99,auVar45);
    auVar27._8_4_ = 0x3fc00000;
    auVar27._0_8_ = 0x3fc000003fc00000;
    auVar27._12_4_ = 0x3fc00000;
    auVar27._16_4_ = 0x3fc00000;
    auVar27._20_4_ = 0x3fc00000;
    auVar27._24_4_ = 0x3fc00000;
    auVar27._28_4_ = 0x3fc00000;
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar93,auVar27);
    auVar46._4_4_ = auVar99._4_4_ * auVar94._4_4_;
    auVar46._0_4_ = auVar99._0_4_ * auVar94._0_4_;
    auVar46._8_4_ = auVar99._8_4_ * auVar94._8_4_;
    auVar46._12_4_ = auVar99._12_4_ * auVar94._12_4_;
    auVar46._16_4_ = auVar99._16_4_ * auVar94._16_4_;
    auVar46._20_4_ = auVar99._20_4_ * auVar94._20_4_;
    auVar46._24_4_ = auVar99._24_4_ * auVar94._24_4_;
    auVar46._28_4_ = auVar93._28_4_;
    auVar93 = vmulps_avx512vl(auVar95,auVar99);
    auVar103 = vmulps_avx512vl(auVar96,auVar99);
    auVar104 = vsubps_avx512vl(auVar111,auVar100);
    auVar105 = vsubps_avx512vl(auVar111,auVar90);
    auVar106 = vsubps_avx512vl(auVar111,auVar101);
    auVar59._4_4_ = uStack_55c;
    auVar59._0_4_ = local_560;
    auVar59._8_4_ = uStack_558;
    auVar59._12_4_ = uStack_554;
    auVar59._16_4_ = uStack_550;
    auVar59._20_4_ = uStack_54c;
    auVar59._24_4_ = uStack_548;
    auVar59._28_4_ = uStack_544;
    auVar107 = vmulps_avx512vl(auVar59,auVar106);
    auVar107 = vfmadd231ps_avx512vl(auVar107,local_540,auVar105);
    auVar107 = vfmadd231ps_avx512vl(auVar107,local_520,auVar104);
    auVar108 = vmulps_avx512vl(auVar106,auVar106);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar105);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar104);
    auVar109 = vmulps_avx512vl(auVar59,auVar103);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar93,local_540);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar46,local_520);
    auVar103 = vmulps_avx512vl(auVar106,auVar103);
    auVar93 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar93);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar104,auVar46);
    local_6c0 = vmulps_avx512vl(auVar109,auVar109);
    auVar103 = vsubps_avx512vl(local_3a0,local_6c0);
    auVar110 = vmulps_avx512vl(auVar109,auVar93);
    auVar107 = vsubps_avx512vl(auVar107,auVar110);
    auVar107 = vaddps_avx512vl(auVar107,auVar107);
    auVar110 = vmulps_avx512vl(auVar93,auVar93);
    local_840 = vsubps_avx512vl(auVar108,auVar110);
    auVar108 = vsubps_avx512vl(local_840,auVar91);
    local_820 = vmulps_avx512vl(auVar107,auVar107);
    auVar28._8_4_ = 0x40800000;
    auVar28._0_8_ = 0x4080000040800000;
    auVar28._12_4_ = 0x40800000;
    auVar28._16_4_ = 0x40800000;
    auVar28._20_4_ = 0x40800000;
    auVar28._24_4_ = 0x40800000;
    auVar28._28_4_ = 0x40800000;
    auVar110 = vmulps_avx512vl(auVar103,auVar28);
    auVar91 = vmulps_avx512vl(auVar110,auVar108);
    auVar91 = vsubps_avx512vl(local_820,auVar91);
    uVar75 = vcmpps_avx512vl(auVar91,auVar111,5);
    bVar67 = (byte)uVar75;
    if (bVar67 == 0) {
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar91 = auVar114;
    }
    else {
      auVar91 = vsqrtps_avx512vl(auVar91);
      auVar111 = vaddps_avx512vl(auVar103,auVar103);
      auVar112 = vrcp14ps_avx512vl(auVar111);
      auVar111 = vfnmadd213ps_avx512vl(auVar111,auVar112,auVar141);
      auVar111 = vfmadd132ps_avx512vl(auVar111,auVar112,auVar112);
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      auVar112 = vxorps_avx512vl(auVar107,auVar29);
      auVar112 = vsubps_avx512vl(auVar112,auVar91);
      auVar112 = vmulps_avx512vl(auVar112,auVar111);
      auVar91 = vsubps_avx512vl(auVar91,auVar107);
      auVar91 = vmulps_avx512vl(auVar91,auVar111);
      auVar111 = vfmadd213ps_avx512vl(auVar109,auVar112,auVar93);
      local_4c0 = vmulps_avx512vl(auVar99,auVar111);
      auVar111 = vfmadd213ps_avx512vl(auVar109,auVar91,auVar93);
      local_4e0 = vmulps_avx512vl(auVar99,auVar111);
      auVar142._8_4_ = 0x7f800000;
      auVar142._0_8_ = 0x7f8000007f800000;
      auVar142._12_4_ = 0x7f800000;
      auVar142._16_4_ = 0x7f800000;
      auVar142._20_4_ = 0x7f800000;
      auVar142._24_4_ = 0x7f800000;
      auVar142._28_4_ = 0x7f800000;
      auVar111 = vblendmps_avx512vl(auVar142,auVar112);
      auVar113._0_4_ =
           (uint)(bVar67 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar67 & 1) * local_4e0._0_4_;
      bVar6 = (bool)((byte)(uVar75 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar6 * auVar111._4_4_ | (uint)!bVar6 * local_4e0._4_4_;
      bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar6 * auVar111._8_4_ | (uint)!bVar6 * local_4e0._8_4_;
      bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar6 * auVar111._12_4_ | (uint)!bVar6 * local_4e0._12_4_;
      bVar6 = (bool)((byte)(uVar75 >> 4) & 1);
      auVar113._16_4_ = (uint)bVar6 * auVar111._16_4_ | (uint)!bVar6 * local_4e0._16_4_;
      bVar6 = (bool)((byte)(uVar75 >> 5) & 1);
      auVar113._20_4_ = (uint)bVar6 * auVar111._20_4_ | (uint)!bVar6 * local_4e0._20_4_;
      bVar6 = (bool)((byte)(uVar75 >> 6) & 1);
      auVar113._24_4_ = (uint)bVar6 * auVar111._24_4_ | (uint)!bVar6 * local_4e0._24_4_;
      bVar6 = SUB81(uVar75 >> 7,0);
      auVar113._28_4_ = (uint)bVar6 * auVar111._28_4_ | (uint)!bVar6 * local_4e0._28_4_;
      auVar143._8_4_ = 0xff800000;
      auVar143._0_8_ = 0xff800000ff800000;
      auVar143._12_4_ = 0xff800000;
      auVar143._16_4_ = 0xff800000;
      auVar143._20_4_ = 0xff800000;
      auVar143._24_4_ = 0xff800000;
      auVar143._28_4_ = 0xff800000;
      auVar111 = vblendmps_avx512vl(auVar143,auVar91);
      auVar114._0_4_ =
           (uint)(bVar67 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar91._0_4_;
      bVar6 = (bool)((byte)(uVar75 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar6 * auVar111._4_4_ | (uint)!bVar6 * auVar91._4_4_;
      bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar6 * auVar111._8_4_ | (uint)!bVar6 * auVar91._8_4_;
      bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar6 * auVar111._12_4_ | (uint)!bVar6 * auVar91._12_4_;
      bVar6 = (bool)((byte)(uVar75 >> 4) & 1);
      auVar114._16_4_ = (uint)bVar6 * auVar111._16_4_ | (uint)!bVar6 * auVar91._16_4_;
      bVar6 = (bool)((byte)(uVar75 >> 5) & 1);
      auVar114._20_4_ = (uint)bVar6 * auVar111._20_4_ | (uint)!bVar6 * auVar91._20_4_;
      bVar6 = (bool)((byte)(uVar75 >> 6) & 1);
      auVar114._24_4_ = (uint)bVar6 * auVar111._24_4_ | (uint)!bVar6 * auVar91._24_4_;
      bVar6 = SUB81(uVar75 >> 7,0);
      auVar114._28_4_ = (uint)bVar6 * auVar111._28_4_ | (uint)!bVar6 * auVar91._28_4_;
      auVar144._8_4_ = 0x7fffffff;
      auVar144._0_8_ = 0x7fffffff7fffffff;
      auVar144._12_4_ = 0x7fffffff;
      auVar144._16_4_ = 0x7fffffff;
      auVar144._20_4_ = 0x7fffffff;
      auVar144._24_4_ = 0x7fffffff;
      auVar144._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_6c0,auVar144);
      auVar91 = vmaxps_avx512vl(local_480,local_6c0);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      auVar91 = vmulps_avx512vl(auVar91,auVar30);
      auVar111 = vandps_avx(auVar103,auVar144);
      uVar72 = vcmpps_avx512vl(auVar111,auVar91,1);
      uVar75 = uVar75 & uVar72;
      bVar71 = (byte)uVar75;
      auVar91 = local_6c0;
      if (bVar71 != 0) {
        uVar72 = vcmpps_avx512vl(auVar108,_DAT_02020f00,2);
        auVar173._8_4_ = 0xff800000;
        auVar173._0_8_ = 0xff800000ff800000;
        auVar173._12_4_ = 0xff800000;
        auVar173._16_4_ = 0xff800000;
        auVar173._20_4_ = 0xff800000;
        auVar173._24_4_ = 0xff800000;
        auVar173._28_4_ = 0xff800000;
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar112 = vblendmps_avx512vl(auVar108,auVar173);
        bVar69 = (byte)uVar72;
        uVar76 = (uint)(bVar69 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar111._0_4_;
        bVar6 = (bool)((byte)(uVar72 >> 1) & 1);
        uVar126 = (uint)bVar6 * auVar112._4_4_ | (uint)!bVar6 * auVar111._4_4_;
        bVar6 = (bool)((byte)(uVar72 >> 2) & 1);
        uVar127 = (uint)bVar6 * auVar112._8_4_ | (uint)!bVar6 * auVar111._8_4_;
        bVar6 = (bool)((byte)(uVar72 >> 3) & 1);
        uVar128 = (uint)bVar6 * auVar112._12_4_ | (uint)!bVar6 * auVar111._12_4_;
        bVar6 = (bool)((byte)(uVar72 >> 4) & 1);
        uVar129 = (uint)bVar6 * auVar112._16_4_ | (uint)!bVar6 * auVar111._16_4_;
        bVar6 = (bool)((byte)(uVar72 >> 5) & 1);
        uVar130 = (uint)bVar6 * auVar112._20_4_ | (uint)!bVar6 * auVar111._20_4_;
        bVar6 = (bool)((byte)(uVar72 >> 6) & 1);
        uVar131 = (uint)bVar6 * auVar112._24_4_ | (uint)!bVar6 * auVar111._24_4_;
        bVar6 = SUB81(uVar72 >> 7,0);
        uVar132 = (uint)bVar6 * auVar112._28_4_ | (uint)!bVar6 * auVar111._28_4_;
        auVar113._0_4_ = (bVar71 & 1) * uVar76 | !(bool)(bVar71 & 1) * auVar113._0_4_;
        bVar6 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar113._4_4_ = bVar6 * uVar126 | !bVar6 * auVar113._4_4_;
        bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar113._8_4_ = bVar6 * uVar127 | !bVar6 * auVar113._8_4_;
        bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar113._12_4_ = bVar6 * uVar128 | !bVar6 * auVar113._12_4_;
        bVar6 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar113._16_4_ = bVar6 * uVar129 | !bVar6 * auVar113._16_4_;
        bVar6 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar113._20_4_ = bVar6 * uVar130 | !bVar6 * auVar113._20_4_;
        bVar6 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar113._24_4_ = bVar6 * uVar131 | !bVar6 * auVar113._24_4_;
        bVar6 = SUB81(uVar75 >> 7,0);
        auVar113._28_4_ = bVar6 * uVar132 | !bVar6 * auVar113._28_4_;
        auVar108 = vblendmps_avx512vl(auVar173,auVar108);
        bVar6 = (bool)((byte)(uVar72 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar72 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar72 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar72 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
        bVar12 = SUB81(uVar72 >> 7,0);
        auVar114._0_4_ =
             (uint)(bVar71 & 1) *
             ((uint)(bVar69 & 1) * auVar108._0_4_ | !(bool)(bVar69 & 1) * uVar76) |
             !(bool)(bVar71 & 1) * auVar114._0_4_;
        bVar74 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar114._4_4_ =
             (uint)bVar74 * ((uint)bVar6 * auVar108._4_4_ | !bVar6 * uVar126) |
             !bVar74 * auVar114._4_4_;
        bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar114._8_4_ =
             (uint)bVar6 * ((uint)bVar7 * auVar108._8_4_ | !bVar7 * uVar127) |
             !bVar6 * auVar114._8_4_;
        bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar114._12_4_ =
             (uint)bVar6 * ((uint)bVar8 * auVar108._12_4_ | !bVar8 * uVar128) |
             !bVar6 * auVar114._12_4_;
        bVar6 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar114._16_4_ =
             (uint)bVar6 * ((uint)bVar9 * auVar108._16_4_ | !bVar9 * uVar129) |
             !bVar6 * auVar114._16_4_;
        bVar6 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar114._20_4_ =
             (uint)bVar6 * ((uint)bVar10 * auVar108._20_4_ | !bVar10 * uVar130) |
             !bVar6 * auVar114._20_4_;
        bVar6 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar114._24_4_ =
             (uint)bVar6 * ((uint)bVar11 * auVar108._24_4_ | !bVar11 * uVar131) |
             !bVar6 * auVar114._24_4_;
        bVar6 = SUB81(uVar75 >> 7,0);
        auVar114._28_4_ =
             (uint)bVar6 * ((uint)bVar12 * auVar108._28_4_ | !bVar12 * uVar132) |
             !bVar6 * auVar114._28_4_;
        bVar67 = (~bVar71 | bVar69) & bVar67;
      }
    }
    in_ZMM31 = ZEXT3264(auVar113);
    if ((bVar67 & 0x7f) == 0) {
LAB_01dddb34:
      auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
    }
    else {
      auVar78 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_690);
      auVar145._0_4_ = auVar78._0_4_;
      auVar145._4_4_ = auVar145._0_4_;
      auVar145._8_4_ = auVar145._0_4_;
      auVar145._12_4_ = auVar145._0_4_;
      auVar145._16_4_ = auVar145._0_4_;
      auVar145._20_4_ = auVar145._0_4_;
      auVar145._24_4_ = auVar145._0_4_;
      auVar145._28_4_ = auVar145._0_4_;
      auVar91 = vmaxps_avx512vl(auVar145,auVar113);
      auVar78 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_690);
      auVar169._0_4_ = auVar78._0_4_;
      auVar169._4_4_ = auVar169._0_4_;
      auVar169._8_4_ = auVar169._0_4_;
      auVar169._12_4_ = auVar169._0_4_;
      auVar169._16_4_ = auVar169._0_4_;
      auVar169._20_4_ = auVar169._0_4_;
      auVar169._24_4_ = auVar169._0_4_;
      auVar169._28_4_ = auVar169._0_4_;
      auVar108 = vminps_avx512vl(auVar169,auVar114);
      auVar106 = vmulps_avx512vl(auVar106,auVar239);
      auVar105 = vfmadd213ps_avx512vl(auVar105,auVar236,auVar106);
      auVar104 = vfmadd213ps_avx512vl(auVar104,auVar234,auVar105);
      auVar60._4_4_ = uStack_55c;
      auVar60._0_4_ = local_560;
      auVar60._8_4_ = uStack_558;
      auVar60._12_4_ = uStack_554;
      auVar60._16_4_ = uStack_550;
      auVar60._20_4_ = uStack_54c;
      auVar60._24_4_ = uStack_548;
      auVar60._28_4_ = uStack_544;
      auVar105 = vmulps_avx512vl(auVar60,auVar239);
      auVar105 = vfmadd231ps_avx512vl(auVar105,local_540,auVar236);
      auVar105 = vfmadd231ps_avx512vl(auVar105,local_520,auVar234);
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar105,auVar106);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar106,auVar111,1);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar112);
      auVar104 = vxorps_avx512vl(auVar104,auVar112);
      auVar115 = vrcp14ps_avx512vl(auVar105);
      auVar116 = vxorps_avx512vl(auVar105,auVar112);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar118 = vfnmadd213ps_avx512vl(auVar115,auVar105,auVar117);
      auVar118 = vfmadd132ps_avx512vl(auVar118,auVar115,auVar115);
      auVar104 = vmulps_avx512vl(auVar118,auVar104);
      uVar15 = vcmpps_avx512vl(auVar105,auVar116,1);
      bVar71 = (byte)uVar14 | (byte)uVar15;
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar119 = vblendmps_avx512vl(auVar104,auVar118);
      auVar120._0_4_ =
           (uint)(bVar71 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar115._0_4_;
      bVar6 = (bool)(bVar71 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar6 * auVar119._4_4_ | (uint)!bVar6 * auVar115._4_4_;
      bVar6 = (bool)(bVar71 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar6 * auVar119._8_4_ | (uint)!bVar6 * auVar115._8_4_;
      bVar6 = (bool)(bVar71 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar6 * auVar119._12_4_ | (uint)!bVar6 * auVar115._12_4_;
      bVar6 = (bool)(bVar71 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar6 * auVar119._16_4_ | (uint)!bVar6 * auVar115._16_4_;
      bVar6 = (bool)(bVar71 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar6 * auVar119._20_4_ | (uint)!bVar6 * auVar115._20_4_;
      bVar6 = (bool)(bVar71 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar6 * auVar119._24_4_ | (uint)!bVar6 * auVar115._24_4_;
      auVar120._28_4_ =
           (uint)(bVar71 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar71 >> 7) * auVar115._28_4_;
      auVar91 = vmaxps_avx(auVar91,auVar120);
      uVar15 = vcmpps_avx512vl(auVar105,auVar116,6);
      bVar71 = (byte)uVar14 | (byte)uVar15;
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar121._0_4_ =
           (uint)(bVar71 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar104._0_4_;
      bVar6 = (bool)(bVar71 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar6 * auVar105._4_4_ | (uint)!bVar6 * auVar104._4_4_;
      bVar6 = (bool)(bVar71 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar6 * auVar105._8_4_ | (uint)!bVar6 * auVar104._8_4_;
      bVar6 = (bool)(bVar71 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar6 * auVar105._12_4_ | (uint)!bVar6 * auVar104._12_4_;
      bVar6 = (bool)(bVar71 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar6 * auVar105._16_4_ | (uint)!bVar6 * auVar104._16_4_;
      bVar6 = (bool)(bVar71 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar6 * auVar105._20_4_ | (uint)!bVar6 * auVar104._20_4_;
      bVar6 = (bool)(bVar71 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar6 * auVar105._24_4_ | (uint)!bVar6 * auVar104._24_4_;
      auVar121._28_4_ =
           (uint)(bVar71 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar71 >> 7) * auVar104._28_4_;
      auVar104 = vminps_avx(auVar108,auVar121);
      auVar92 = vsubps_avx(ZEXT832(0) << 0x20,auVar92);
      auVar97 = vsubps_avx(ZEXT832(0) << 0x20,auVar97);
      auVar98 = vsubps_avx(ZEXT832(0) << 0x20,auVar98);
      auVar98 = vmulps_avx512vl(auVar98,auVar89);
      auVar97 = vfnmsub231ps_avx512vl(auVar98,auVar88,auVar97);
      auVar92 = vfnmadd231ps_avx512vl(auVar97,auVar102,auVar92);
      auVar97 = vmulps_avx512vl(auVar60,auVar89);
      auVar97 = vfnmsub231ps_avx512vl(auVar97,local_540,auVar88);
      auVar97 = vfnmadd231ps_avx512vl(auVar97,local_520,auVar102);
      vandps_avx512vl(auVar97,auVar106);
      uVar14 = vcmpps_avx512vl(auVar97,auVar111,1);
      auVar92 = vxorps_avx512vl(auVar92,auVar112);
      auVar98 = vrcp14ps_avx512vl(auVar97);
      auVar102 = vxorps_avx512vl(auVar97,auVar112);
      auVar89 = vfnmadd213ps_avx512vl(auVar98,auVar97,auVar117);
      auVar78 = vfmadd132ps_fma(auVar89,auVar98,auVar98);
      fVar206 = auVar78._0_4_ * auVar92._0_4_;
      fVar133 = auVar78._4_4_ * auVar92._4_4_;
      auVar47._4_4_ = fVar133;
      auVar47._0_4_ = fVar206;
      fVar212 = auVar78._8_4_ * auVar92._8_4_;
      auVar47._8_4_ = fVar212;
      fVar213 = auVar78._12_4_ * auVar92._12_4_;
      auVar47._12_4_ = fVar213;
      fVar229 = auVar92._16_4_ * 0.0;
      auVar47._16_4_ = fVar229;
      fVar214 = auVar92._20_4_ * 0.0;
      auVar47._20_4_ = fVar214;
      fVar215 = auVar92._24_4_ * 0.0;
      auVar47._24_4_ = fVar215;
      auVar47._28_4_ = auVar92._28_4_;
      uVar15 = vcmpps_avx512vl(auVar97,auVar102,1);
      bVar71 = (byte)uVar14 | (byte)uVar15;
      auVar89 = vblendmps_avx512vl(auVar47,auVar118);
      auVar122._0_4_ =
           (uint)(bVar71 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar98._0_4_;
      bVar6 = (bool)(bVar71 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar6 * auVar89._4_4_ | (uint)!bVar6 * auVar98._4_4_;
      bVar6 = (bool)(bVar71 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar6 * auVar89._8_4_ | (uint)!bVar6 * auVar98._8_4_;
      bVar6 = (bool)(bVar71 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar6 * auVar89._12_4_ | (uint)!bVar6 * auVar98._12_4_;
      bVar6 = (bool)(bVar71 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar6 * auVar89._16_4_ | (uint)!bVar6 * auVar98._16_4_;
      bVar6 = (bool)(bVar71 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar6 * auVar89._20_4_ | (uint)!bVar6 * auVar98._20_4_;
      bVar6 = (bool)(bVar71 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar6 * auVar89._24_4_ | (uint)!bVar6 * auVar98._24_4_;
      auVar122._28_4_ =
           (uint)(bVar71 >> 7) * auVar89._28_4_ | (uint)!(bool)(bVar71 >> 7) * auVar98._28_4_;
      _local_5a0 = vmaxps_avx(auVar91,auVar122);
      uVar15 = vcmpps_avx512vl(auVar97,auVar102,6);
      bVar71 = (byte)uVar14 | (byte)uVar15;
      auVar91._0_4_ = (uint)(bVar71 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar71 & 1) * (int)fVar206
      ;
      bVar6 = (bool)(bVar71 >> 1 & 1);
      auVar91._4_4_ = (uint)bVar6 * auVar105._4_4_ | (uint)!bVar6 * (int)fVar133;
      bVar6 = (bool)(bVar71 >> 2 & 1);
      auVar91._8_4_ = (uint)bVar6 * auVar105._8_4_ | (uint)!bVar6 * (int)fVar212;
      bVar6 = (bool)(bVar71 >> 3 & 1);
      auVar91._12_4_ = (uint)bVar6 * auVar105._12_4_ | (uint)!bVar6 * (int)fVar213;
      bVar6 = (bool)(bVar71 >> 4 & 1);
      auVar91._16_4_ = (uint)bVar6 * auVar105._16_4_ | (uint)!bVar6 * (int)fVar229;
      bVar6 = (bool)(bVar71 >> 5 & 1);
      auVar91._20_4_ = (uint)bVar6 * auVar105._20_4_ | (uint)!bVar6 * (int)fVar214;
      bVar6 = (bool)(bVar71 >> 6 & 1);
      auVar91._24_4_ = (uint)bVar6 * auVar105._24_4_ | (uint)!bVar6 * (int)fVar215;
      auVar91._28_4_ =
           (uint)(bVar71 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar71 >> 7) * auVar92._28_4_;
      local_400 = vminps_avx(auVar104,auVar91);
      auVar224 = ZEXT3264(local_400);
      auVar92 = _local_5a0;
      uVar14 = vcmpps_avx512vl(_local_5a0,local_400,2);
      bVar67 = bVar67 & 0x7f & (byte)uVar14;
      if (bVar67 == 0) goto LAB_01dddb34;
      auVar91 = vmaxps_avx(ZEXT832(0) << 0x20,local_720);
      auVar97 = vminps_avx512vl(local_4c0,auVar117);
      auVar55 = ZEXT412(0);
      auVar102 = ZEXT1232(auVar55) << 0x20;
      auVar97 = vmaxps_avx(auVar97,ZEXT1232(auVar55) << 0x20);
      auVar98 = vminps_avx512vl(local_4e0,auVar117);
      auVar48._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
      auVar48._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
      auVar48._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
      auVar48._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
      auVar48._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
      auVar48._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
      auVar48._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
      auVar48._28_4_ = auVar97._28_4_ + 7.0;
      local_4c0 = vfmadd213ps_avx512vl(auVar48,local_700,local_880);
      auVar97 = vmaxps_avx(auVar98,ZEXT1232(auVar55) << 0x20);
      auVar49._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
      auVar49._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
      auVar49._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
      auVar49._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
      auVar49._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
      auVar49._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
      auVar49._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
      auVar49._28_4_ = auVar97._28_4_ + 7.0;
      local_4e0 = vfmadd213ps_avx512vl(auVar49,local_700,local_880);
      auVar50._4_4_ = auVar91._4_4_ * auVar91._4_4_;
      auVar50._0_4_ = auVar91._0_4_ * auVar91._0_4_;
      auVar50._8_4_ = auVar91._8_4_ * auVar91._8_4_;
      auVar50._12_4_ = auVar91._12_4_ * auVar91._12_4_;
      auVar50._16_4_ = auVar91._16_4_ * auVar91._16_4_;
      auVar50._20_4_ = auVar91._20_4_ * auVar91._20_4_;
      auVar50._24_4_ = auVar91._24_4_ * auVar91._24_4_;
      auVar50._28_4_ = local_4e0._28_4_;
      auVar97 = vsubps_avx(local_840,auVar50);
      auVar91 = vmulps_avx512vl(auVar110,auVar97);
      auVar98 = vsubps_avx(local_820,auVar91);
      uVar14 = vcmpps_avx512vl(auVar98,ZEXT1232(auVar55) << 0x20,5);
      bVar71 = (byte)uVar14;
      auVar89 = SUB6432(ZEXT864(0),0) << 0x20;
      if (bVar71 == 0) {
        auVar93 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar193 = ZEXT864(0) << 0x20;
        auVar98 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar225 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar123._8_4_ = 0x7f800000;
        auVar123._0_8_ = 0x7f8000007f800000;
        auVar123._12_4_ = 0x7f800000;
        auVar123._16_4_ = 0x7f800000;
        auVar123._20_4_ = 0x7f800000;
        auVar123._24_4_ = 0x7f800000;
        auVar123._28_4_ = 0x7f800000;
        auVar124._8_4_ = 0xff800000;
        auVar124._0_8_ = 0xff800000ff800000;
        auVar124._12_4_ = 0xff800000;
        auVar124._16_4_ = 0xff800000;
        auVar124._20_4_ = 0xff800000;
        auVar124._24_4_ = 0xff800000;
        auVar124._28_4_ = 0xff800000;
      }
      else {
        auVar79 = vxorps_avx512vl(auVar88._0_16_,auVar88._0_16_);
        uVar75 = vcmpps_avx512vl(auVar98,ZEXT832(0) << 0x20,5);
        auVar91 = vsqrtps_avx(auVar98);
        auVar170._0_4_ = auVar103._0_4_ + auVar103._0_4_;
        auVar170._4_4_ = auVar103._4_4_ + auVar103._4_4_;
        auVar170._8_4_ = auVar103._8_4_ + auVar103._8_4_;
        auVar170._12_4_ = auVar103._12_4_ + auVar103._12_4_;
        auVar170._16_4_ = auVar103._16_4_ + auVar103._16_4_;
        auVar170._20_4_ = auVar103._20_4_ + auVar103._20_4_;
        auVar170._24_4_ = auVar103._24_4_ + auVar103._24_4_;
        auVar170._28_4_ = auVar103._28_4_ + auVar103._28_4_;
        auVar98 = vrcp14ps_avx512vl(auVar170);
        auVar102 = vfnmadd213ps_avx512vl(auVar170,auVar98,auVar117);
        auVar78 = vfmadd132ps_fma(auVar102,auVar98,auVar98);
        auVar31._8_4_ = 0x80000000;
        auVar31._0_8_ = 0x8000000080000000;
        auVar31._12_4_ = 0x80000000;
        auVar31._16_4_ = 0x80000000;
        auVar31._20_4_ = 0x80000000;
        auVar31._24_4_ = 0x80000000;
        auVar31._28_4_ = 0x80000000;
        auVar98 = vxorps_avx512vl(auVar107,auVar31);
        auVar98 = vsubps_avx(auVar98,auVar91);
        auVar51._4_4_ = auVar98._4_4_ * auVar78._4_4_;
        auVar51._0_4_ = auVar98._0_4_ * auVar78._0_4_;
        auVar51._8_4_ = auVar98._8_4_ * auVar78._8_4_;
        auVar51._12_4_ = auVar98._12_4_ * auVar78._12_4_;
        auVar51._16_4_ = auVar98._16_4_ * 0.0;
        auVar51._20_4_ = auVar98._20_4_ * 0.0;
        auVar51._24_4_ = auVar98._24_4_ * 0.0;
        auVar51._28_4_ = 0x3e000000;
        auVar91 = vsubps_avx512vl(auVar91,auVar107);
        auVar52._4_4_ = auVar91._4_4_ * auVar78._4_4_;
        auVar52._0_4_ = auVar91._0_4_ * auVar78._0_4_;
        auVar52._8_4_ = auVar91._8_4_ * auVar78._8_4_;
        auVar52._12_4_ = auVar91._12_4_ * auVar78._12_4_;
        auVar52._16_4_ = auVar91._16_4_ * 0.0;
        auVar52._20_4_ = auVar91._20_4_ * 0.0;
        auVar52._24_4_ = auVar91._24_4_ * 0.0;
        auVar52._28_4_ = fVar134;
        auVar91 = vfmadd213ps_avx512vl(auVar109,auVar51,auVar93);
        auVar53._4_4_ = auVar99._4_4_ * auVar91._4_4_;
        auVar53._0_4_ = auVar99._0_4_ * auVar91._0_4_;
        auVar53._8_4_ = auVar99._8_4_ * auVar91._8_4_;
        auVar53._12_4_ = auVar99._12_4_ * auVar91._12_4_;
        auVar53._16_4_ = auVar99._16_4_ * auVar91._16_4_;
        auVar53._20_4_ = auVar99._20_4_ * auVar91._20_4_;
        auVar53._24_4_ = auVar99._24_4_ * auVar91._24_4_;
        auVar53._28_4_ = auVar98._28_4_;
        auVar91 = vmulps_avx512vl(local_520,auVar51);
        auVar102 = vmulps_avx512vl(local_540,auVar51);
        auVar61._4_4_ = uStack_55c;
        auVar61._0_4_ = local_560;
        auVar61._8_4_ = uStack_558;
        auVar61._12_4_ = uStack_554;
        auVar61._16_4_ = uStack_550;
        auVar61._20_4_ = uStack_54c;
        auVar61._24_4_ = uStack_548;
        auVar61._28_4_ = uStack_544;
        auVar88 = vmulps_avx512vl(auVar61,auVar51);
        auVar98 = vfmadd213ps_avx512vl(auVar94,auVar53,auVar100);
        auVar98 = vsubps_avx512vl(auVar91,auVar98);
        auVar91 = vfmadd213ps_avx512vl(auVar95,auVar53,auVar90);
        auVar89 = vsubps_avx512vl(auVar102,auVar91);
        auVar78 = vfmadd213ps_fma(auVar53,auVar96,auVar101);
        auVar91 = vsubps_avx(auVar88,ZEXT1632(auVar78));
        auVar225 = auVar91._0_28_;
        auVar91 = vfmadd213ps_avx512vl(auVar109,auVar52,auVar93);
        auVar91 = vmulps_avx512vl(auVar99,auVar91);
        auVar93 = vmulps_avx512vl(local_520,auVar52);
        auVar99 = vmulps_avx512vl(local_540,auVar52);
        auVar88 = vmulps_avx512vl(auVar61,auVar52);
        auVar78 = vfmadd213ps_fma(auVar94,auVar91,auVar100);
        auVar102 = vsubps_avx(auVar93,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar95,auVar91,auVar90);
        auVar93 = vsubps_avx512vl(auVar99,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar96,auVar91,auVar101);
        auVar91 = vsubps_avx512vl(auVar88,ZEXT1632(auVar78));
        auVar193 = ZEXT3264(auVar91);
        auVar184._8_4_ = 0x7f800000;
        auVar184._0_8_ = 0x7f8000007f800000;
        auVar184._12_4_ = 0x7f800000;
        auVar184._16_4_ = 0x7f800000;
        auVar184._20_4_ = 0x7f800000;
        auVar184._24_4_ = 0x7f800000;
        auVar184._28_4_ = 0x7f800000;
        auVar91 = vblendmps_avx512vl(auVar184,auVar51);
        bVar6 = (bool)((byte)uVar75 & 1);
        auVar123._0_4_ = (uint)bVar6 * auVar91._0_4_ | (uint)!bVar6 * auVar100._0_4_;
        bVar6 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar6 * auVar91._4_4_ | (uint)!bVar6 * auVar100._4_4_;
        bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar6 * auVar91._8_4_ | (uint)!bVar6 * auVar100._8_4_;
        bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar6 * auVar91._12_4_ | (uint)!bVar6 * auVar100._12_4_;
        bVar6 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar123._16_4_ = (uint)bVar6 * auVar91._16_4_ | (uint)!bVar6 * auVar100._16_4_;
        bVar6 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar123._20_4_ = (uint)bVar6 * auVar91._20_4_ | (uint)!bVar6 * auVar100._20_4_;
        bVar6 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar123._24_4_ = (uint)bVar6 * auVar91._24_4_ | (uint)!bVar6 * auVar100._24_4_;
        bVar6 = SUB81(uVar75 >> 7,0);
        auVar123._28_4_ = (uint)bVar6 * auVar91._28_4_ | (uint)!bVar6 * auVar100._28_4_;
        auVar185._8_4_ = 0xff800000;
        auVar185._0_8_ = 0xff800000ff800000;
        auVar185._12_4_ = 0xff800000;
        auVar185._16_4_ = 0xff800000;
        auVar185._20_4_ = 0xff800000;
        auVar185._24_4_ = 0xff800000;
        auVar185._28_4_ = 0xff800000;
        auVar91 = vblendmps_avx512vl(auVar185,auVar52);
        bVar6 = (bool)((byte)uVar75 & 1);
        auVar124._0_4_ = (uint)bVar6 * auVar91._0_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar6 * auVar91._4_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar6 * auVar91._8_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar6 * auVar91._12_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar124._16_4_ = (uint)bVar6 * auVar91._16_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar124._20_4_ = (uint)bVar6 * auVar91._20_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar124._24_4_ = (uint)bVar6 * auVar91._24_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = SUB81(uVar75 >> 7,0);
        auVar124._28_4_ = (uint)bVar6 * auVar91._28_4_ | (uint)!bVar6 * -0x800000;
        auVar218._8_4_ = 0x7fffffff;
        auVar218._0_8_ = 0x7fffffff7fffffff;
        auVar218._12_4_ = 0x7fffffff;
        auVar218._16_4_ = 0x7fffffff;
        auVar218._20_4_ = 0x7fffffff;
        auVar218._24_4_ = 0x7fffffff;
        auVar218._28_4_ = 0x7fffffff;
        auVar91 = vandps_avx(auVar218,local_6c0);
        auVar91 = vmaxps_avx(local_480,auVar91);
        auVar32._8_4_ = 0x36000000;
        auVar32._0_8_ = 0x3600000036000000;
        auVar32._12_4_ = 0x36000000;
        auVar32._16_4_ = 0x36000000;
        auVar32._20_4_ = 0x36000000;
        auVar32._24_4_ = 0x36000000;
        auVar32._28_4_ = 0x36000000;
        auVar91 = vmulps_avx512vl(auVar91,auVar32);
        auVar94 = vandps_avx(auVar103,auVar218);
        uVar72 = vcmpps_avx512vl(auVar94,auVar91,1);
        uVar75 = uVar75 & uVar72;
        bVar69 = (byte)uVar75;
        if (bVar69 != 0) {
          uVar72 = vcmpps_avx512vl(auVar97,ZEXT1632(auVar79),2);
          auVar219._8_4_ = 0xff800000;
          auVar219._0_8_ = 0xff800000ff800000;
          auVar219._12_4_ = 0xff800000;
          auVar219._16_4_ = 0xff800000;
          auVar219._20_4_ = 0xff800000;
          auVar219._24_4_ = 0xff800000;
          auVar219._28_4_ = 0xff800000;
          auVar235._8_4_ = 0x7f800000;
          auVar235._0_8_ = 0x7f8000007f800000;
          auVar235._12_4_ = 0x7f800000;
          auVar235._16_4_ = 0x7f800000;
          auVar235._20_4_ = 0x7f800000;
          auVar235._24_4_ = 0x7f800000;
          auVar235._28_4_ = 0x7f800000;
          auVar94 = vblendmps_avx512vl(auVar235,auVar219);
          bVar68 = (byte)uVar72;
          uVar76 = (uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar91._0_4_;
          bVar6 = (bool)((byte)(uVar72 >> 1) & 1);
          uVar126 = (uint)bVar6 * auVar94._4_4_ | (uint)!bVar6 * auVar91._4_4_;
          bVar6 = (bool)((byte)(uVar72 >> 2) & 1);
          uVar127 = (uint)bVar6 * auVar94._8_4_ | (uint)!bVar6 * auVar91._8_4_;
          bVar6 = (bool)((byte)(uVar72 >> 3) & 1);
          uVar128 = (uint)bVar6 * auVar94._12_4_ | (uint)!bVar6 * auVar91._12_4_;
          bVar6 = (bool)((byte)(uVar72 >> 4) & 1);
          uVar129 = (uint)bVar6 * auVar94._16_4_ | (uint)!bVar6 * auVar91._16_4_;
          bVar6 = (bool)((byte)(uVar72 >> 5) & 1);
          uVar130 = (uint)bVar6 * auVar94._20_4_ | (uint)!bVar6 * auVar91._20_4_;
          bVar6 = (bool)((byte)(uVar72 >> 6) & 1);
          uVar131 = (uint)bVar6 * auVar94._24_4_ | (uint)!bVar6 * auVar91._24_4_;
          bVar6 = SUB81(uVar72 >> 7,0);
          uVar132 = (uint)bVar6 * auVar94._28_4_ | (uint)!bVar6 * auVar91._28_4_;
          auVar123._0_4_ = (bVar69 & 1) * uVar76 | !(bool)(bVar69 & 1) * auVar123._0_4_;
          bVar6 = (bool)((byte)(uVar75 >> 1) & 1);
          auVar123._4_4_ = bVar6 * uVar126 | !bVar6 * auVar123._4_4_;
          bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
          auVar123._8_4_ = bVar6 * uVar127 | !bVar6 * auVar123._8_4_;
          bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
          auVar123._12_4_ = bVar6 * uVar128 | !bVar6 * auVar123._12_4_;
          bVar6 = (bool)((byte)(uVar75 >> 4) & 1);
          auVar123._16_4_ = bVar6 * uVar129 | !bVar6 * auVar123._16_4_;
          bVar6 = (bool)((byte)(uVar75 >> 5) & 1);
          auVar123._20_4_ = bVar6 * uVar130 | !bVar6 * auVar123._20_4_;
          bVar6 = (bool)((byte)(uVar75 >> 6) & 1);
          auVar123._24_4_ = bVar6 * uVar131 | !bVar6 * auVar123._24_4_;
          bVar6 = SUB81(uVar75 >> 7,0);
          auVar123._28_4_ = bVar6 * uVar132 | !bVar6 * auVar123._28_4_;
          auVar94 = vblendmps_avx512vl(auVar219,auVar235);
          bVar6 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar72 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar72 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar72 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
          bVar12 = SUB81(uVar72 >> 7,0);
          auVar91._0_4_ =
               (uint)(bVar69 & 1) *
               ((uint)(bVar68 & 1) * auVar94._0_4_ | !(bool)(bVar68 & 1) * uVar76) |
               !(bool)(bVar69 & 1) * auVar124._0_4_;
          bVar74 = (bool)((byte)(uVar75 >> 1) & 1);
          auVar91._4_4_ =
               (uint)bVar74 * ((uint)bVar6 * auVar94._4_4_ | !bVar6 * uVar126) |
               !bVar74 * auVar124._4_4_;
          bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
          auVar91._8_4_ =
               (uint)bVar6 * ((uint)bVar7 * auVar94._8_4_ | !bVar7 * uVar127) |
               !bVar6 * auVar124._8_4_;
          bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
          auVar91._12_4_ =
               (uint)bVar6 * ((uint)bVar8 * auVar94._12_4_ | !bVar8 * uVar128) |
               !bVar6 * auVar124._12_4_;
          bVar6 = (bool)((byte)(uVar75 >> 4) & 1);
          auVar91._16_4_ =
               (uint)bVar6 * ((uint)bVar9 * auVar94._16_4_ | !bVar9 * uVar129) |
               !bVar6 * auVar124._16_4_;
          bVar6 = (bool)((byte)(uVar75 >> 5) & 1);
          auVar91._20_4_ =
               (uint)bVar6 * ((uint)bVar10 * auVar94._20_4_ | !bVar10 * uVar130) |
               !bVar6 * auVar124._20_4_;
          bVar6 = (bool)((byte)(uVar75 >> 6) & 1);
          auVar91._24_4_ =
               (uint)bVar6 * ((uint)bVar11 * auVar94._24_4_ | !bVar11 * uVar131) |
               !bVar6 * auVar124._24_4_;
          bVar6 = SUB81(uVar75 >> 7,0);
          auVar91._28_4_ =
               (uint)bVar6 * ((uint)bVar12 * auVar94._28_4_ | !bVar12 * uVar132) |
               !bVar6 * auVar124._28_4_;
          bVar71 = (~bVar69 | bVar68) & bVar71;
          auVar124 = auVar91;
        }
      }
      auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar238._8_4_ = 0x7fffffff;
      auVar238._0_8_ = 0x7fffffff7fffffff;
      auVar238._12_4_ = 0x7fffffff;
      uVar226 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar211._4_4_ = uVar226;
      auVar211._0_4_ = uVar226;
      auVar211._8_4_ = uVar226;
      auVar211._12_4_ = uVar226;
      auVar211._16_4_ = uVar226;
      auVar211._20_4_ = uVar226;
      auVar211._24_4_ = uVar226;
      auVar211._28_4_ = uVar226;
      uVar226 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar220._4_4_ = uVar226;
      auVar220._0_4_ = uVar226;
      auVar220._8_4_ = uVar226;
      auVar220._12_4_ = uVar226;
      auVar220._16_4_ = uVar226;
      auVar220._20_4_ = uVar226;
      auVar220._24_4_ = uVar226;
      auVar220._28_4_ = uVar226;
      fVar206 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar205._0_4_ = fVar206 * auVar193._0_4_;
      auVar205._4_4_ = fVar206 * auVar193._4_4_;
      auVar205._8_4_ = fVar206 * auVar193._8_4_;
      auVar205._12_4_ = fVar206 * auVar193._12_4_;
      auVar205._16_4_ = fVar206 * auVar193._16_4_;
      auVar205._20_4_ = fVar206 * auVar193._20_4_;
      auVar205._28_36_ = auVar193._28_36_;
      auVar205._24_4_ = fVar206 * auVar193._24_4_;
      auVar78 = vfmadd231ps_fma(auVar205._0_32_,auVar220,auVar93);
      auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar211,auVar102);
      _local_460 = _local_5a0;
      local_440 = vminps_avx(local_400,auVar123);
      auVar230._8_4_ = 0x7fffffff;
      auVar230._0_8_ = 0x7fffffff7fffffff;
      auVar230._12_4_ = 0x7fffffff;
      auVar230._16_4_ = 0x7fffffff;
      auVar230._20_4_ = 0x7fffffff;
      auVar230._24_4_ = 0x7fffffff;
      auVar230._28_4_ = 0x7fffffff;
      auVar93 = vandps_avx(auVar230,ZEXT1632(auVar78));
      auVar200 = ZEXT3264(auVar93);
      _local_420 = vmaxps_avx(_local_5a0,auVar124);
      auVar187._8_4_ = 0x3e99999a;
      auVar187._0_8_ = 0x3e99999a3e99999a;
      auVar187._12_4_ = 0x3e99999a;
      auVar187._16_4_ = 0x3e99999a;
      auVar187._20_4_ = 0x3e99999a;
      auVar187._24_4_ = 0x3e99999a;
      auVar187._28_4_ = 0x3e99999a;
      uVar14 = vcmpps_avx512vl(auVar93,auVar187,1);
      local_784 = (int)uVar14;
      uVar14 = vcmpps_avx512vl(_local_5a0,local_440,2);
      bVar69 = (byte)uVar14 & bVar67;
      _local_580 = _local_420;
      uVar15 = vcmpps_avx512vl(_local_420,local_400,2);
      if ((bVar67 & ((byte)uVar15 | (byte)uVar14)) != 0) {
        auVar54._4_4_ = auVar225._4_4_ * fVar206;
        auVar54._0_4_ = auVar225._0_4_ * fVar206;
        auVar54._8_4_ = auVar225._8_4_ * fVar206;
        auVar54._12_4_ = auVar225._12_4_ * fVar206;
        auVar54._16_4_ = auVar225._16_4_ * fVar206;
        auVar54._20_4_ = auVar225._20_4_ * fVar206;
        auVar54._24_4_ = auVar225._24_4_ * fVar206;
        auVar54._28_4_ = 0x3e99999a;
        auVar78 = vfmadd213ps_fma(auVar89,auVar220,auVar54);
        auVar78 = vfmadd213ps_fma(auVar98,auVar211,ZEXT1632(auVar78));
        auVar91 = vandps_avx(auVar230,ZEXT1632(auVar78));
        uVar14 = vcmpps_avx512vl(auVar91,auVar187,1);
        local_78c = (uint)(byte)~bVar71;
        bVar71 = (byte)uVar14 | ~bVar71;
        auVar147._8_4_ = 2;
        auVar147._0_8_ = 0x200000002;
        auVar147._12_4_ = 2;
        auVar147._16_4_ = 2;
        auVar147._20_4_ = 2;
        auVar147._24_4_ = 2;
        auVar147._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar91 = vpblendmd_avx512vl(auVar147,auVar33);
        local_3e0._0_4_ = (uint)(bVar71 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar71 & 1) * 2;
        bVar6 = (bool)(bVar71 >> 1 & 1);
        local_3e0._4_4_ = (uint)bVar6 * auVar91._4_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar71 >> 2 & 1);
        local_3e0._8_4_ = (uint)bVar6 * auVar91._8_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar71 >> 3 & 1);
        local_3e0._12_4_ = (uint)bVar6 * auVar91._12_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar71 >> 4 & 1);
        local_3e0._16_4_ = (uint)bVar6 * auVar91._16_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar71 >> 5 & 1);
        local_3e0._20_4_ = (uint)bVar6 * auVar91._20_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar71 >> 6 & 1);
        local_3e0._24_4_ = (uint)bVar6 * auVar91._24_4_ | (uint)!bVar6 * 2;
        local_3e0._28_4_ = (uint)(bVar71 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar71 >> 7) * 2;
        local_4a0 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_4a0,local_3e0,5);
        local_788 = (uint)bVar69;
        bVar69 = (byte)uVar14 & bVar69;
        if (bVar69 != 0) {
          auVar79 = vminps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar78 = vmaxps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar80 = vminps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar81 = vminps_avx(auVar79,auVar80);
          auVar79 = vmaxps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar80 = vmaxps_avx(auVar78,auVar79);
          auVar78 = vandps_avx(auVar238,auVar81);
          auVar79 = vandps_avx(auVar238,auVar80);
          auVar78 = vmaxps_avx(auVar78,auVar79);
          auVar79 = vmovshdup_avx(auVar78);
          auVar79 = vmaxss_avx(auVar79,auVar78);
          auVar78 = vshufpd_avx(auVar78,auVar78,1);
          auVar78 = vmaxss_avx(auVar78,auVar79);
          fVar206 = auVar78._0_4_ * 1.9073486e-06;
          local_6a0 = vshufps_avx(auVar80,auVar80,0xff);
          local_500 = (float)local_5a0._0_4_ + (float)local_6e0._0_4_;
          fStack_4fc = (float)local_5a0._4_4_ + (float)local_6e0._4_4_;
          fStack_4f8 = fStack_598 + fStack_6d8;
          fStack_4f4 = fStack_594 + fStack_6d4;
          fStack_4f0 = fStack_590 + fStack_6d0;
          fStack_4ec = fStack_58c + fStack_6cc;
          fStack_4e8 = fStack_588 + fStack_6c8;
          fStack_4e4 = fStack_584 + fStack_6c4;
          _local_5a0 = auVar92;
          do {
            auVar94 = local_880;
            auVar148._8_4_ = 0x7f800000;
            auVar148._0_8_ = 0x7f8000007f800000;
            auVar148._12_4_ = 0x7f800000;
            auVar148._16_4_ = 0x7f800000;
            auVar148._20_4_ = 0x7f800000;
            auVar148._24_4_ = 0x7f800000;
            auVar148._28_4_ = 0x7f800000;
            auVar91 = vblendmps_avx512vl(auVar148,_local_5a0);
            auVar125._0_4_ =
                 (uint)(bVar69 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar69 & 1) * 0x7f800000;
            bVar6 = (bool)(bVar69 >> 1 & 1);
            auVar125._4_4_ = (uint)bVar6 * auVar91._4_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar69 >> 2 & 1);
            auVar125._8_4_ = (uint)bVar6 * auVar91._8_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar69 >> 3 & 1);
            auVar125._12_4_ = (uint)bVar6 * auVar91._12_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar69 >> 4 & 1);
            auVar125._16_4_ = (uint)bVar6 * auVar91._16_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar69 >> 5 & 1);
            auVar125._20_4_ = (uint)bVar6 * auVar91._20_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar69 >> 6 & 1);
            auVar125._24_4_ = (uint)bVar6 * auVar91._24_4_ | (uint)!bVar6 * 0x7f800000;
            auVar125._28_4_ =
                 (uint)(bVar69 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar69 >> 7) * 0x7f800000;
            auVar91 = vshufps_avx(auVar125,auVar125,0xb1);
            auVar91 = vminps_avx(auVar125,auVar91);
            auVar93 = vshufpd_avx(auVar91,auVar91,5);
            auVar91 = vminps_avx(auVar91,auVar93);
            auVar93 = vpermpd_avx2(auVar91,0x4e);
            auVar91 = vminps_avx(auVar91,auVar93);
            uVar14 = vcmpps_avx512vl(auVar125,auVar91,0);
            bVar68 = (byte)uVar14 & bVar69;
            bVar71 = bVar69;
            if (bVar68 != 0) {
              bVar71 = bVar68;
            }
            iVar17 = 0;
            for (uVar76 = (uint)bVar71; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            auVar224 = ZEXT464(*(uint *)(local_4c0 + (uint)(iVar17 << 2)));
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_6c0._0_16_ = (undefined1  [16])aVar1;
            auVar78 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar78._0_4_ < 0.0) {
              local_820._0_16_ = ZEXT416(*(uint *)(local_4c0 + (uint)(iVar17 << 2)));
              local_840._0_16_ = ZEXT416((uint)*(float *)(local_460 + (uint)(iVar17 << 2)));
              local_880[1] = 0;
              local_880[0] = bVar69;
              local_880._2_30_ = auVar94._2_30_;
              fVar212 = sqrtf(auVar78._0_4_);
              bVar69 = local_880[0];
              auVar224 = ZEXT1664(local_820._0_16_);
              auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar133 = (float)local_840._0_4_;
              uVar226 = local_840._4_4_;
              uVar227 = local_840._8_4_;
              uVar228 = local_840._12_4_;
            }
            else {
              auVar78 = vsqrtss_avx(auVar78,auVar78);
              fVar212 = auVar78._0_4_;
              fVar133 = *(float *)(local_460 + (uint)(iVar17 << 2));
              uVar226 = 0;
              uVar227 = 0;
              uVar228 = 0;
            }
            lVar73 = 4;
            do {
              auVar91 = local_840;
              auVar135._4_4_ = fVar133;
              auVar135._0_4_ = fVar133;
              auVar135._8_4_ = fVar133;
              auVar135._12_4_ = fVar133;
              auVar77 = auVar237._0_16_;
              auVar79 = vfmadd132ps_fma(auVar135,auVar77,local_6c0._0_16_);
              fVar229 = auVar224._0_4_;
              fVar213 = 1.0 - fVar229;
              auVar174._0_4_ = local_600._0_4_ * fVar229;
              auVar174._4_4_ = local_600._4_4_ * fVar229;
              auVar174._8_4_ = local_600._8_4_ * fVar229;
              auVar174._12_4_ = local_600._12_4_ * fVar229;
              local_640 = ZEXT416((uint)fVar213);
              auVar190._4_4_ = fVar213;
              auVar190._0_4_ = fVar213;
              auVar190._8_4_ = fVar213;
              auVar190._12_4_ = fVar213;
              auVar78 = vfmadd231ps_fma(auVar174,auVar190,local_5c0._0_16_);
              auVar194._0_4_ = local_5e0._0_4_ * fVar229;
              auVar194._4_4_ = local_5e0._4_4_ * fVar229;
              auVar194._8_4_ = local_5e0._8_4_ * fVar229;
              auVar194._12_4_ = local_5e0._12_4_ * fVar229;
              auVar80 = vfmadd231ps_fma(auVar194,auVar190,local_600._0_16_);
              auVar201._0_4_ = fVar229 * (float)local_620._0_4_;
              auVar201._4_4_ = fVar229 * (float)local_620._4_4_;
              auVar201._8_4_ = fVar229 * fStack_618;
              auVar201._12_4_ = fVar229 * fStack_614;
              auVar81 = vfmadd231ps_fma(auVar201,auVar190,local_5e0._0_16_);
              auVar207._0_4_ = fVar229 * auVar80._0_4_;
              auVar207._4_4_ = fVar229 * auVar80._4_4_;
              auVar207._8_4_ = fVar229 * auVar80._8_4_;
              auVar207._12_4_ = fVar229 * auVar80._12_4_;
              auVar78 = vfmadd231ps_fma(auVar207,auVar190,auVar78);
              auVar175._0_4_ = fVar229 * auVar81._0_4_;
              auVar175._4_4_ = fVar229 * auVar81._4_4_;
              auVar175._8_4_ = fVar229 * auVar81._8_4_;
              auVar175._12_4_ = fVar229 * auVar81._12_4_;
              auVar80 = vfmadd231ps_fma(auVar175,auVar190,auVar80);
              auVar195._0_4_ = fVar229 * auVar80._0_4_;
              auVar195._4_4_ = fVar229 * auVar80._4_4_;
              auVar195._8_4_ = fVar229 * auVar80._8_4_;
              auVar195._12_4_ = fVar229 * auVar80._12_4_;
              local_630 = vfmadd231ps_fma(auVar195,auVar78,auVar190);
              auVar78 = vsubps_avx(auVar80,auVar78);
              auVar18._8_4_ = 0x40400000;
              auVar18._0_8_ = 0x4040000040400000;
              auVar18._12_4_ = 0x40400000;
              auVar80 = vmulps_avx512vl(auVar78,auVar18);
              auVar78 = vsubps_avx(auVar79,local_630);
              local_700._0_16_ = auVar78;
              auVar78 = vdpps_avx(auVar78,auVar78,0x7f);
              local_880._0_16_ = auVar80;
              local_720._0_16_ = auVar78;
              local_820._0_16_ = auVar224._0_16_;
              local_840._4_4_ = uVar226;
              local_840._0_4_ = fVar133;
              local_840._8_4_ = uVar227;
              local_840._16_16_ = auVar91._16_16_;
              local_840._12_4_ = uVar228;
              if (auVar78._0_4_ < 0.0) {
                auVar224._0_4_ = sqrtf(auVar78._0_4_);
                auVar224._4_60_ = extraout_var;
                auVar77 = ZEXT816(0) << 0x40;
                auVar78 = auVar224._0_16_;
                auVar80 = local_880._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
              }
              local_650 = vdpps_avx(auVar80,auVar80,0x7f);
              fVar213 = local_650._0_4_;
              auVar155._4_12_ = auVar77._4_12_;
              auVar155._0_4_ = fVar213;
              local_7e0 = vrsqrt14ss_avx512f(auVar77,auVar155);
              fVar133 = local_7e0._0_4_ * 1.5;
              local_660 = vrcp14ss_avx512f(auVar77,auVar155);
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(local_650,auVar19);
              auVar79 = vfnmadd213ss_fma(local_660,local_650,ZEXT416(0x40000000));
              uVar76 = auVar78._0_4_;
              if (fVar213 < auVar81._0_4_) {
                local_7f0._0_4_ = fVar133;
                auVar152._0_4_ = sqrtf(fVar213);
                auVar152._4_60_ = extraout_var_00;
                auVar78 = ZEXT416(uVar76);
                auVar77 = ZEXT816(0) << 0x40;
                auVar81 = auVar152._0_16_;
                auVar80 = local_880._0_16_;
              }
              else {
                auVar81 = vsqrtss_avx512f(local_650,local_650);
                local_7f0._0_4_ = fVar133;
              }
              fVar133 = local_7e0._0_4_;
              fVar133 = (float)local_7f0._0_4_ + fVar213 * -0.5 * fVar133 * fVar133 * fVar133;
              local_7f0._0_4_ = auVar80._0_4_ * fVar133;
              local_7f0._4_4_ = auVar80._4_4_ * fVar133;
              local_7f0._8_4_ = auVar80._8_4_ * fVar133;
              local_7f0._12_4_ = auVar80._12_4_ * fVar133;
              local_7e0 = vdpps_avx(local_700._0_16_,local_7f0,0x7f);
              fVar229 = auVar78._0_4_;
              auVar136._0_4_ = local_7e0._0_4_ * local_7e0._0_4_;
              auVar136._4_4_ = local_7e0._4_4_ * local_7e0._4_4_;
              auVar136._8_4_ = local_7e0._8_4_ * local_7e0._8_4_;
              auVar136._12_4_ = local_7e0._12_4_ * local_7e0._12_4_;
              auVar86 = vsubps_avx(local_720._0_16_,auVar136);
              fVar213 = auVar86._0_4_;
              auVar156._4_12_ = auVar77._4_12_;
              auVar156._0_4_ = fVar213;
              auVar77 = vrsqrt14ss_avx512f(auVar77,auVar156);
              auVar82 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
              auVar83 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
              if (fVar213 < 0.0) {
                local_680 = fVar133;
                fStack_67c = fVar133;
                fStack_678 = fVar133;
                fStack_674 = fVar133;
                local_670 = auVar77;
                fVar213 = sqrtf(fVar213);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar81 = ZEXT416(auVar81._0_4_);
                auVar78 = ZEXT416(uVar76);
                auVar80 = local_880._0_16_;
                auVar77 = local_670;
                fVar133 = local_680;
                fVar134 = fStack_67c;
                fVar214 = fStack_678;
                fVar215 = fStack_674;
              }
              else {
                auVar86 = vsqrtss_avx(auVar86,auVar86);
                fVar213 = auVar86._0_4_;
                fVar134 = fVar133;
                fVar214 = fVar133;
                fVar215 = fVar133;
              }
              auVar238._8_4_ = 0x7fffffff;
              auVar238._0_8_ = 0x7fffffff7fffffff;
              auVar238._12_4_ = 0x7fffffff;
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_820._0_16_,local_640);
              fVar189 = auVar86._0_4_ * 6.0;
              fVar13 = local_820._0_4_ * 6.0;
              auVar176._0_4_ = fVar13 * (float)local_620._0_4_;
              auVar176._4_4_ = fVar13 * (float)local_620._4_4_;
              auVar176._8_4_ = fVar13 * fStack_618;
              auVar176._12_4_ = fVar13 * fStack_614;
              auVar157._4_4_ = fVar189;
              auVar157._0_4_ = fVar189;
              auVar157._8_4_ = fVar189;
              auVar157._12_4_ = fVar189;
              auVar86 = vfmadd132ps_fma(auVar157,auVar176,local_5e0._0_16_);
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_640,local_820._0_16_);
              fVar189 = auVar85._0_4_ * 6.0;
              auVar177._4_4_ = fVar189;
              auVar177._0_4_ = fVar189;
              auVar177._8_4_ = fVar189;
              auVar177._12_4_ = fVar189;
              auVar86 = vfmadd132ps_fma(auVar177,auVar86,local_600._0_16_);
              fVar189 = local_640._0_4_ * 6.0;
              auVar158._4_4_ = fVar189;
              auVar158._0_4_ = fVar189;
              auVar158._8_4_ = fVar189;
              auVar158._12_4_ = fVar189;
              auVar86 = vfmadd132ps_fma(auVar158,auVar86,local_5c0._0_16_);
              auVar178._0_4_ = auVar86._0_4_ * (float)local_650._0_4_;
              auVar178._4_4_ = auVar86._4_4_ * (float)local_650._0_4_;
              auVar178._8_4_ = auVar86._8_4_ * (float)local_650._0_4_;
              auVar178._12_4_ = auVar86._12_4_ * (float)local_650._0_4_;
              auVar86 = vdpps_avx(auVar80,auVar86,0x7f);
              fVar189 = auVar86._0_4_;
              auVar159._0_4_ = auVar80._0_4_ * fVar189;
              auVar159._4_4_ = auVar80._4_4_ * fVar189;
              auVar159._8_4_ = auVar80._8_4_ * fVar189;
              auVar159._12_4_ = auVar80._12_4_ * fVar189;
              auVar86 = vsubps_avx(auVar178,auVar159);
              fVar189 = auVar79._0_4_ * (float)local_660._0_4_;
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar84 = vxorps_avx512vl(auVar80,auVar20);
              auVar196._0_4_ = fVar133 * auVar86._0_4_ * fVar189;
              auVar196._4_4_ = fVar134 * auVar86._4_4_ * fVar189;
              auVar196._8_4_ = fVar214 * auVar86._8_4_ * fVar189;
              auVar196._12_4_ = fVar215 * auVar86._12_4_ * fVar189;
              auVar79 = vdpps_avx(auVar84,local_7f0,0x7f);
              auVar86 = vmaxss_avx(ZEXT416((uint)fVar206),
                                   ZEXT416((uint)((float)local_840._0_4_ * fVar212 * 1.9073486e-06))
                                  );
              auVar85 = vdivss_avx512f(ZEXT416((uint)fVar206),auVar81);
              auVar81 = vdpps_avx(local_700._0_16_,auVar196,0x7f);
              auVar78 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar206),auVar86);
              auVar85 = vfmadd213ss_fma(ZEXT416((uint)(fVar229 + 1.0)),auVar85,auVar78);
              auVar78 = vdpps_avx(local_6c0._0_16_,local_7f0,0x7f);
              fVar133 = auVar79._0_4_ + auVar81._0_4_;
              auVar79 = vdpps_avx(local_700._0_16_,auVar84,0x7f);
              auVar83 = vmulss_avx512f(auVar83,auVar77);
              auVar77 = vmulss_avx512f(auVar77,auVar77);
              auVar81 = vdpps_avx(local_700._0_16_,local_6c0._0_16_,0x7f);
              auVar77 = vaddss_avx512f(auVar82,ZEXT416((uint)(auVar83._0_4_ * auVar77._0_4_)));
              auVar82 = vfnmadd231ss_avx512f(auVar79,local_7e0,ZEXT416((uint)fVar133));
              auVar83 = vfnmadd231ss_avx512f(auVar81,local_7e0,auVar78);
              auVar79 = vpermilps_avx(local_630,0xff);
              fVar213 = fVar213 - auVar79._0_4_;
              auVar79 = vshufps_avx(auVar80,auVar80,0xff);
              auVar81 = vfmsub213ss_fma(auVar82,auVar77,auVar79);
              fVar229 = auVar83._0_4_ * auVar77._0_4_;
              auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar81._0_4_)),
                                        ZEXT416((uint)fVar133),ZEXT416((uint)fVar229));
              fVar134 = auVar77._0_4_;
              auVar208._0_4_ = fVar229 / fVar134;
              auVar208._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar202._0_4_ = auVar81._0_4_ / fVar134;
              auVar202._4_12_ = auVar81._4_12_;
              auVar81 = vmulss_avx512f(local_7e0,auVar208);
              auVar77 = vmulss_avx512f(local_7e0,auVar202);
              fVar133 = fVar213 * (fVar133 / fVar134) - auVar77._0_4_;
              auVar200 = ZEXT464((uint)fVar133);
              fVar229 = local_820._0_4_ - (auVar81._0_4_ - fVar213 * (auVar78._0_4_ / fVar134));
              auVar224 = ZEXT464((uint)fVar229);
              fVar133 = (float)local_840._0_4_ - fVar133;
              uVar226 = 0;
              uVar227 = 0;
              uVar228 = 0;
              auVar78 = vandps_avx512vl(local_7e0,auVar238);
              if (auVar85._0_4_ <= auVar78._0_4_) {
                bVar6 = false;
                auVar237 = ZEXT864(0) << 0x20;
              }
              else {
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar85._0_4_ + auVar86._0_4_)),local_6a0,
                                          ZEXT416(0x36000000));
                auVar78 = vandps_avx(auVar238,ZEXT416((uint)fVar213));
                auVar56._12_4_ = 0;
                auVar56._0_12_ = ZEXT812(0);
                auVar237 = ZEXT1264(ZEXT812(0)) << 0x20;
                if (auVar81._0_4_ <= auVar78._0_4_) {
                  bVar6 = false;
                }
                else {
                  fVar133 = fVar133 + (float)local_690._0_4_;
                  uVar226 = 0;
                  uVar227 = 0;
                  uVar228 = 0;
                  bVar6 = true;
                  if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar133) {
                    fVar213 = (ray->super_RayK<1>).tfar;
                    auVar200 = ZEXT464((uint)fVar213);
                    if (((fVar133 <= fVar213) && (0.0 <= fVar229)) && (fVar229 <= 1.0)) {
                      auVar78 = vrsqrt14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)local_720._0_4_));
                      fVar134 = auVar78._0_4_;
                      pGVar4 = (context->scene->geometries).items[local_888].ptr;
                      if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar134 = fVar134 * 1.5 +
                                  local_720._0_4_ * -0.5 * fVar134 * fVar134 * fVar134;
                        auVar160._0_4_ = local_700._0_4_ * fVar134;
                        auVar160._4_4_ = local_700._4_4_ * fVar134;
                        auVar160._8_4_ = local_700._8_4_ * fVar134;
                        auVar160._12_4_ = local_700._12_4_ * fVar134;
                        auVar81 = vfmadd213ps_fma(auVar79,auVar160,auVar80);
                        auVar78 = vshufps_avx(auVar160,auVar160,0xc9);
                        auVar79 = vshufps_avx(auVar80,auVar80,0xc9);
                        auVar161._0_4_ = auVar160._0_4_ * auVar79._0_4_;
                        auVar161._4_4_ = auVar160._4_4_ * auVar79._4_4_;
                        auVar161._8_4_ = auVar160._8_4_ * auVar79._8_4_;
                        auVar161._12_4_ = auVar160._12_4_ * auVar79._12_4_;
                        auVar80 = vfmsub231ps_fma(auVar161,auVar80,auVar78);
                        auVar78 = vshufps_avx(auVar80,auVar80,0xc9);
                        auVar79 = vshufps_avx(auVar81,auVar81,0xc9);
                        auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                        auVar137._0_4_ = auVar81._0_4_ * auVar80._0_4_;
                        auVar137._4_4_ = auVar81._4_4_ * auVar80._4_4_;
                        auVar137._8_4_ = auVar81._8_4_ * auVar80._8_4_;
                        auVar137._12_4_ = auVar81._12_4_ * auVar80._12_4_;
                        auVar78 = vfmsub231ps_fma(auVar137,auVar78,auVar79);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar133;
                          auVar79 = vshufps_avx(auVar78,auVar78,0xe9);
                          uVar14 = vmovlps_avx(auVar79);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar14;
                          (ray->Ng).field_0.field_0.z = auVar78._0_4_;
                          ray->u = fVar229;
                          ray->v = 0.0;
                          ray->primID = (uint)local_848;
                          ray->geomID = (uint)local_888;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar79 = vshufps_avx(auVar78,auVar78,0xe9);
                          local_770 = vmovlps_avx(auVar79);
                          local_768 = auVar78._0_4_;
                          local_764 = fVar229;
                          local_760 = 0;
                          local_75c = (uint)local_848;
                          local_758 = (uint)local_888;
                          local_754 = context->user->instID[0];
                          local_750 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar133;
                          local_88c = -1;
                          local_7c0.valid = &local_88c;
                          local_7c0.geometryUserPtr = pGVar4->userPtr;
                          local_7c0.context = context->user;
                          local_7c0.ray = (RTCRayN *)ray;
                          local_7c0.hit = (RTCHitN *)&local_770;
                          local_7c0.N = 1;
                          local_820._0_16_ = ZEXT416((uint)fVar229);
                          local_840._0_16_ = ZEXT416((uint)fVar133);
                          local_880._0_4_ = fVar213;
                          if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01dde64b:
                            p_Var5 = context->args->filter;
                            if (p_Var5 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var5)(&local_7c0);
                                auVar200 = ZEXT464((uint)local_880._0_4_);
                                auVar224 = ZEXT1664(local_820._0_16_);
                                auVar238._8_4_ = 0x7fffffff;
                                auVar238._0_8_ = 0x7fffffff7fffffff;
                                auVar238._12_4_ = 0x7fffffff;
                                auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
                                fVar133 = (float)local_840._0_4_;
                                uVar226 = local_840._4_4_;
                                uVar227 = local_840._8_4_;
                                uVar228 = local_840._12_4_;
                              }
                              if (*local_7c0.valid == 0) goto LAB_01dde704;
                            }
                            (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_7c0.hit;
                            (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_7c0.hit + 4);
                            (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_7c0.hit + 8);
                            *(float *)((long)local_7c0.ray + 0x3c) = *(float *)(local_7c0.hit + 0xc)
                            ;
                            *(float *)((long)local_7c0.ray + 0x40) =
                                 *(float *)(local_7c0.hit + 0x10);
                            *(float *)((long)local_7c0.ray + 0x44) =
                                 *(float *)(local_7c0.hit + 0x14);
                            *(float *)((long)local_7c0.ray + 0x48) =
                                 *(float *)(local_7c0.hit + 0x18);
                            *(float *)((long)local_7c0.ray + 0x4c) =
                                 *(float *)(local_7c0.hit + 0x1c);
                            *(float *)((long)local_7c0.ray + 0x50) =
                                 *(float *)(local_7c0.hit + 0x20);
                          }
                          else {
                            (*pGVar4->intersectionFilterN)(&local_7c0);
                            auVar200 = ZEXT464((uint)local_880._0_4_);
                            auVar224 = ZEXT1664(local_820._0_16_);
                            auVar238._8_4_ = 0x7fffffff;
                            auVar238._0_8_ = 0x7fffffff7fffffff;
                            auVar238._12_4_ = 0x7fffffff;
                            auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
                            fVar133 = (float)local_840._0_4_;
                            uVar226 = local_840._4_4_;
                            uVar227 = local_840._8_4_;
                            uVar228 = local_840._12_4_;
                            if (*local_7c0.valid != 0) goto LAB_01dde64b;
LAB_01dde704:
                            (ray->super_RayK<1>).tfar = auVar200._0_4_;
                          }
                        }
                      }
                    }
                  }
                }
              }
              bVar74 = lVar73 != 0;
              lVar73 = lVar73 + -1;
            } while ((!bVar6) && (bVar74));
            auVar62._4_4_ = fStack_4fc;
            auVar62._0_4_ = local_500;
            auVar62._8_4_ = fStack_4f8;
            auVar62._12_4_ = fStack_4f4;
            auVar62._16_4_ = fStack_4f0;
            auVar62._20_4_ = fStack_4ec;
            auVar62._24_4_ = fStack_4e8;
            auVar62._28_4_ = fStack_4e4;
            fVar133 = (ray->super_RayK<1>).tfar;
            auVar34._4_4_ = fVar133;
            auVar34._0_4_ = fVar133;
            auVar34._8_4_ = fVar133;
            auVar34._12_4_ = fVar133;
            auVar34._16_4_ = fVar133;
            auVar34._20_4_ = fVar133;
            auVar34._24_4_ = fVar133;
            auVar34._28_4_ = fVar133;
            uVar14 = vcmpps_avx512vl(auVar62,auVar34,2);
            bVar69 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar69 & (byte)uVar14;
          } while (bVar69 != 0);
        }
        auVar149._0_4_ = (float)local_580._0_4_ + (float)local_6e0._0_4_;
        auVar149._4_4_ = (float)local_580._4_4_ + (float)local_6e0._4_4_;
        auVar149._8_4_ = fStack_578 + fStack_6d8;
        auVar149._12_4_ = fStack_574 + fStack_6d4;
        auVar149._16_4_ = fStack_570 + fStack_6d0;
        auVar149._20_4_ = fStack_56c + fStack_6cc;
        auVar149._24_4_ = fStack_568 + fStack_6c8;
        auVar149._28_4_ = fStack_564 + fStack_6c4;
        fVar206 = (ray->super_RayK<1>).tfar;
        auVar35._4_4_ = fVar206;
        auVar35._0_4_ = fVar206;
        auVar35._8_4_ = fVar206;
        auVar35._12_4_ = fVar206;
        auVar35._16_4_ = fVar206;
        auVar35._20_4_ = fVar206;
        auVar35._24_4_ = fVar206;
        auVar35._28_4_ = fVar206;
        uVar14 = vcmpps_avx512vl(auVar149,auVar35,2);
        bVar71 = (byte)local_784 | (byte)local_78c;
        bVar67 = (byte)uVar15 & bVar67 & (byte)uVar14;
        auVar150._8_4_ = 2;
        auVar150._0_8_ = 0x200000002;
        auVar150._12_4_ = 2;
        auVar150._16_4_ = 2;
        auVar150._20_4_ = 2;
        auVar150._24_4_ = 2;
        auVar150._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar93 = vpblendmd_avx512vl(auVar150,auVar36);
        auVar91._0_4_ = (uint)(bVar71 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar71 & 1) * 2;
        bVar6 = (bool)(bVar71 >> 1 & 1);
        auVar91._4_4_ = (uint)bVar6 * auVar93._4_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar71 >> 2 & 1);
        auVar91._8_4_ = (uint)bVar6 * auVar93._8_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar71 >> 3 & 1);
        auVar91._12_4_ = (uint)bVar6 * auVar93._12_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar71 >> 4 & 1);
        auVar91._16_4_ = (uint)bVar6 * auVar93._16_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar71 >> 5 & 1);
        auVar91._20_4_ = (uint)bVar6 * auVar93._20_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar71 >> 6 & 1);
        auVar91._24_4_ = (uint)bVar6 * auVar93._24_4_ | (uint)!bVar6 * 2;
        auVar91._28_4_ = (uint)(bVar71 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar71 >> 7) * 2;
        _local_580 = auVar91;
        uVar14 = vpcmpd_avx512vl(auVar91,local_4a0,2);
        bVar71 = (byte)uVar14 & bVar67;
        if (bVar71 != 0) {
          auVar79 = vminps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar78 = vmaxps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar80 = vminps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar81 = vminps_avx(auVar79,auVar80);
          auVar79 = vmaxps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar80 = vmaxps_avx(auVar78,auVar79);
          auVar78 = vandps_avx(auVar238,auVar81);
          auVar79 = vandps_avx(auVar238,auVar80);
          auVar78 = vmaxps_avx(auVar78,auVar79);
          auVar79 = vmovshdup_avx(auVar78);
          auVar79 = vmaxss_avx(auVar79,auVar78);
          auVar78 = vshufpd_avx(auVar78,auVar78,1);
          auVar78 = vmaxss_avx(auVar78,auVar79);
          fVar206 = auVar78._0_4_ * 1.9073486e-06;
          local_6a0 = vshufps_avx(auVar80,auVar80,0xff);
          _local_5a0 = _local_420;
          local_500 = (float)local_420._0_4_ + (float)local_6e0._0_4_;
          fStack_4fc = (float)local_420._4_4_ + (float)local_6e0._4_4_;
          fStack_4f8 = fStack_418 + fStack_6d8;
          fStack_4f4 = fStack_414 + fStack_6d4;
          fStack_4f0 = fStack_410 + fStack_6d0;
          fStack_4ec = fStack_40c + fStack_6cc;
          fStack_4e8 = fStack_408 + fStack_6c8;
          fStack_4e4 = fStack_404 + fStack_6c4;
          do {
            auVar95 = local_880;
            auVar151._8_4_ = 0x7f800000;
            auVar151._0_8_ = 0x7f8000007f800000;
            auVar151._12_4_ = 0x7f800000;
            auVar151._16_4_ = 0x7f800000;
            auVar151._20_4_ = 0x7f800000;
            auVar151._24_4_ = 0x7f800000;
            auVar151._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar151,_local_5a0);
            auVar91._0_4_ =
                 (uint)(bVar71 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar71 & 1) * 0x7f800000;
            bVar6 = (bool)(bVar71 >> 1 & 1);
            auVar91._4_4_ = (uint)bVar6 * auVar93._4_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar71 >> 2 & 1);
            auVar91._8_4_ = (uint)bVar6 * auVar93._8_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar71 >> 3 & 1);
            auVar91._12_4_ = (uint)bVar6 * auVar93._12_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar71 >> 4 & 1);
            auVar91._16_4_ = (uint)bVar6 * auVar93._16_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar71 >> 5 & 1);
            auVar91._20_4_ = (uint)bVar6 * auVar93._20_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar71 >> 6 & 1);
            auVar91._24_4_ = (uint)bVar6 * auVar93._24_4_ | (uint)!bVar6 * 0x7f800000;
            auVar91._28_4_ =
                 (uint)(bVar71 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar71 >> 7) * 0x7f800000;
            auVar93 = vshufps_avx(auVar91,auVar91,0xb1);
            auVar93 = vminps_avx(auVar91,auVar93);
            auVar94 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar94);
            auVar94 = vpermpd_avx2(auVar93,0x4e);
            auVar93 = vminps_avx(auVar93,auVar94);
            uVar14 = vcmpps_avx512vl(auVar91,auVar93,0);
            bVar68 = (byte)uVar14 & bVar71;
            bVar69 = bVar71;
            if (bVar68 != 0) {
              bVar69 = bVar68;
            }
            iVar17 = 0;
            for (uVar76 = (uint)bVar69; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_6c0._0_16_ = (undefined1  [16])aVar1;
            auVar78 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar78._0_4_ < 0.0) {
              local_820._0_16_ = ZEXT416((uint)*(float *)(local_4e0 + (uint)(iVar17 << 2)));
              local_840._0_16_ = ZEXT416((uint)*(float *)(local_400 + (uint)(iVar17 << 2)));
              local_880[1] = 0;
              local_880[0] = bVar71;
              local_880._2_30_ = auVar95._2_30_;
              fVar213 = sqrtf(auVar78._0_4_);
              bVar71 = local_880[0];
              auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar212 = (float)local_820._0_4_;
              uVar226 = local_820._4_4_;
              uVar227 = local_820._8_4_;
              uVar228 = local_820._12_4_;
              fVar133 = (float)local_840._0_4_;
              uVar231 = local_840._4_4_;
              uVar232 = local_840._8_4_;
              uVar233 = local_840._12_4_;
            }
            else {
              auVar78 = vsqrtss_avx(auVar78,auVar78);
              fVar213 = auVar78._0_4_;
              fVar212 = *(float *)(local_4e0 + (uint)(iVar17 << 2));
              uVar226 = 0;
              uVar227 = 0;
              uVar228 = 0;
              fVar133 = *(float *)(local_400 + (uint)(iVar17 << 2));
              uVar231 = 0;
              uVar232 = 0;
              uVar233 = 0;
            }
            lVar73 = 4;
            do {
              auVar94 = local_820;
              auVar93 = local_840;
              auVar138._4_4_ = fVar133;
              auVar138._0_4_ = fVar133;
              auVar138._8_4_ = fVar133;
              auVar138._12_4_ = fVar133;
              auVar77 = auVar237._0_16_;
              auVar79 = vfmadd132ps_fma(auVar138,auVar77,local_6c0._0_16_);
              fVar229 = 1.0 - fVar212;
              auVar179._0_4_ = local_600._0_4_ * fVar212;
              auVar179._4_4_ = local_600._4_4_ * fVar212;
              auVar179._8_4_ = local_600._8_4_ * fVar212;
              auVar179._12_4_ = local_600._12_4_ * fVar212;
              local_640 = ZEXT416((uint)fVar229);
              auVar191._4_4_ = fVar229;
              auVar191._0_4_ = fVar229;
              auVar191._8_4_ = fVar229;
              auVar191._12_4_ = fVar229;
              auVar78 = vfmadd231ps_fma(auVar179,auVar191,local_5c0._0_16_);
              auVar197._0_4_ = local_5e0._0_4_ * fVar212;
              auVar197._4_4_ = local_5e0._4_4_ * fVar212;
              auVar197._8_4_ = local_5e0._8_4_ * fVar212;
              auVar197._12_4_ = local_5e0._12_4_ * fVar212;
              auVar80 = vfmadd231ps_fma(auVar197,auVar191,local_600._0_16_);
              auVar203._0_4_ = fVar212 * (float)local_620._0_4_;
              auVar203._4_4_ = fVar212 * (float)local_620._4_4_;
              auVar203._8_4_ = fVar212 * fStack_618;
              auVar203._12_4_ = fVar212 * fStack_614;
              auVar81 = vfmadd231ps_fma(auVar203,auVar191,local_5e0._0_16_);
              auVar209._0_4_ = fVar212 * auVar80._0_4_;
              auVar209._4_4_ = fVar212 * auVar80._4_4_;
              auVar209._8_4_ = fVar212 * auVar80._8_4_;
              auVar209._12_4_ = fVar212 * auVar80._12_4_;
              auVar78 = vfmadd231ps_fma(auVar209,auVar191,auVar78);
              auVar180._0_4_ = fVar212 * auVar81._0_4_;
              auVar180._4_4_ = fVar212 * auVar81._4_4_;
              auVar180._8_4_ = fVar212 * auVar81._8_4_;
              auVar180._12_4_ = fVar212 * auVar81._12_4_;
              auVar80 = vfmadd231ps_fma(auVar180,auVar191,auVar80);
              auVar198._0_4_ = fVar212 * auVar80._0_4_;
              auVar198._4_4_ = fVar212 * auVar80._4_4_;
              auVar198._8_4_ = fVar212 * auVar80._8_4_;
              auVar198._12_4_ = fVar212 * auVar80._12_4_;
              local_630 = vfmadd231ps_fma(auVar198,auVar78,auVar191);
              auVar78 = vsubps_avx(auVar80,auVar78);
              auVar21._8_4_ = 0x40400000;
              auVar21._0_8_ = 0x4040000040400000;
              auVar21._12_4_ = 0x40400000;
              auVar81 = auVar91._16_16_;
              auVar80 = vmulps_avx512vl(auVar78,auVar21);
              auVar78 = vsubps_avx(auVar79,local_630);
              local_700._0_16_ = auVar78;
              auVar78 = vdpps_avx(auVar78,auVar78,0x7f);
              local_880._0_16_ = auVar80;
              local_720._0_16_ = auVar78;
              local_820._4_4_ = uVar226;
              local_820._0_4_ = fVar212;
              local_820._8_4_ = uVar227;
              local_820._16_16_ = auVar94._16_16_;
              local_820._12_4_ = uVar228;
              local_840._4_4_ = uVar231;
              local_840._0_4_ = fVar133;
              local_840._8_4_ = uVar232;
              local_840._16_16_ = auVar93._16_16_;
              local_840._12_4_ = uVar233;
              if (auVar78._0_4_ < 0.0) {
                auVar153._0_4_ = sqrtf(auVar78._0_4_);
                auVar153._4_60_ = extraout_var_01;
                auVar77 = ZEXT816(0) << 0x40;
                auVar78 = auVar153._0_16_;
                auVar80 = local_880._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
              }
              local_650 = vdpps_avx(auVar80,auVar80,0x7f);
              fVar212 = local_650._0_4_;
              auVar162._4_12_ = auVar77._4_12_;
              auVar162._0_4_ = fVar212;
              local_7e0 = vrsqrt14ss_avx512f(auVar77,auVar162);
              fVar133 = local_7e0._0_4_ * 1.5;
              local_660 = vrcp14ss_avx512f(auVar77,auVar162);
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar86 = vxorps_avx512vl(local_650,auVar22);
              auVar79 = vfnmadd213ss_fma(local_660,local_650,ZEXT416(0x40000000));
              uVar76 = auVar78._0_4_;
              if (fVar212 < auVar86._0_4_) {
                local_7f0._0_4_ = fVar133;
                auVar154._0_4_ = sqrtf(fVar212);
                auVar154._4_60_ = extraout_var_02;
                auVar78 = ZEXT416(uVar76);
                auVar77 = ZEXT816(0) << 0x40;
                auVar86 = auVar154._0_16_;
                auVar80 = local_880._0_16_;
              }
              else {
                auVar86 = vsqrtss_avx512f(local_650,local_650);
                local_7f0._0_4_ = fVar133;
              }
              fVar133 = local_7e0._0_4_;
              fVar133 = (float)local_7f0._0_4_ + fVar212 * -0.5 * fVar133 * fVar133 * fVar133;
              local_7f0._0_4_ = auVar80._0_4_ * fVar133;
              local_7f0._4_4_ = auVar80._4_4_ * fVar133;
              local_7f0._8_4_ = auVar80._8_4_ * fVar133;
              local_7f0._12_4_ = auVar80._12_4_ * fVar133;
              local_7e0 = vdpps_avx(local_700._0_16_,local_7f0,0x7f);
              fVar229 = auVar78._0_4_;
              auVar139._0_4_ = local_7e0._0_4_ * local_7e0._0_4_;
              auVar139._4_4_ = local_7e0._4_4_ * local_7e0._4_4_;
              auVar139._8_4_ = local_7e0._8_4_ * local_7e0._8_4_;
              auVar139._12_4_ = local_7e0._12_4_ * local_7e0._12_4_;
              auVar82 = vsubps_avx(local_720._0_16_,auVar139);
              fVar212 = auVar82._0_4_;
              auVar163._4_12_ = auVar77._4_12_;
              auVar163._0_4_ = fVar212;
              auVar77 = vrsqrt14ss_avx512f(auVar77,auVar163);
              auVar83 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
              auVar85 = vmulss_avx512f(auVar82,ZEXT416(0xbf000000));
              if (fVar212 < 0.0) {
                local_680 = fVar133;
                fStack_67c = fVar133;
                fStack_678 = fVar133;
                fStack_674 = fVar133;
                local_670 = auVar77;
                fVar134 = sqrtf(fVar212);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar78 = ZEXT416(uVar76);
                auVar80 = local_880._0_16_;
                auVar77 = local_670;
                fVar133 = local_680;
                fVar212 = fStack_67c;
                fVar214 = fStack_678;
                fVar215 = fStack_674;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                fVar134 = auVar82._0_4_;
                fVar212 = fVar133;
                fVar214 = fVar133;
                fVar215 = fVar133;
              }
              auVar222._8_4_ = 0x7fffffff;
              auVar222._0_8_ = 0x7fffffff7fffffff;
              auVar222._12_4_ = 0x7fffffff;
              auVar224 = ZEXT1664(auVar222);
              auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_820._0_16_,local_640);
              fVar189 = auVar82._0_4_ * 6.0;
              fVar13 = local_820._0_4_ * 6.0;
              auVar181._0_4_ = fVar13 * (float)local_620._0_4_;
              auVar181._4_4_ = fVar13 * (float)local_620._4_4_;
              auVar181._8_4_ = fVar13 * fStack_618;
              auVar181._12_4_ = fVar13 * fStack_614;
              auVar164._4_4_ = fVar189;
              auVar164._0_4_ = fVar189;
              auVar164._8_4_ = fVar189;
              auVar164._12_4_ = fVar189;
              auVar82 = vfmadd132ps_fma(auVar164,auVar181,local_5e0._0_16_);
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_640,local_820._0_16_);
              fVar189 = auVar84._0_4_ * 6.0;
              auVar182._4_4_ = fVar189;
              auVar182._0_4_ = fVar189;
              auVar182._8_4_ = fVar189;
              auVar182._12_4_ = fVar189;
              auVar82 = vfmadd132ps_fma(auVar182,auVar82,local_600._0_16_);
              fVar189 = local_640._0_4_ * 6.0;
              auVar165._4_4_ = fVar189;
              auVar165._0_4_ = fVar189;
              auVar165._8_4_ = fVar189;
              auVar165._12_4_ = fVar189;
              auVar82 = vfmadd132ps_fma(auVar165,auVar82,local_5c0._0_16_);
              auVar183._0_4_ = auVar82._0_4_ * (float)local_650._0_4_;
              auVar183._4_4_ = auVar82._4_4_ * (float)local_650._0_4_;
              auVar183._8_4_ = auVar82._8_4_ * (float)local_650._0_4_;
              auVar183._12_4_ = auVar82._12_4_ * (float)local_650._0_4_;
              auVar82 = vdpps_avx(auVar80,auVar82,0x7f);
              fVar189 = auVar82._0_4_;
              auVar166._0_4_ = auVar80._0_4_ * fVar189;
              auVar166._4_4_ = auVar80._4_4_ * fVar189;
              auVar166._8_4_ = auVar80._8_4_ * fVar189;
              auVar166._12_4_ = auVar80._12_4_ * fVar189;
              auVar82 = vsubps_avx(auVar183,auVar166);
              fVar189 = auVar79._0_4_ * (float)local_660._0_4_;
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar87 = vxorps_avx512vl(auVar80,auVar23);
              auVar199._0_4_ = fVar133 * auVar82._0_4_ * fVar189;
              auVar199._4_4_ = fVar212 * auVar82._4_4_ * fVar189;
              auVar199._8_4_ = fVar214 * auVar82._8_4_ * fVar189;
              auVar199._12_4_ = fVar215 * auVar82._12_4_ * fVar189;
              auVar79 = vdpps_avx(auVar87,local_7f0,0x7f);
              auVar82 = vmaxss_avx(ZEXT416((uint)fVar206),
                                   ZEXT416((uint)((float)local_840._0_4_ * fVar213 * 1.9073486e-06))
                                  );
              auVar84 = vdivss_avx512f(ZEXT416((uint)fVar206),auVar86);
              auVar86 = vdpps_avx(local_700._0_16_,auVar199,0x7f);
              auVar78 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar206),auVar82);
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(fVar229 + 1.0)),auVar84,auVar78);
              auVar78 = vdpps_avx(local_6c0._0_16_,local_7f0,0x7f);
              fVar133 = auVar79._0_4_ + auVar86._0_4_;
              auVar79 = vdpps_avx(local_700._0_16_,auVar87,0x7f);
              auVar86 = vmulss_avx512f(auVar85,auVar77);
              auVar85 = vmulss_avx512f(auVar77,auVar77);
              auVar77 = vdpps_avx(local_700._0_16_,local_6c0._0_16_,0x7f);
              auVar86 = vaddss_avx512f(auVar83,ZEXT416((uint)(auVar86._0_4_ * auVar85._0_4_)));
              auVar83 = vfnmadd231ss_avx512f(auVar79,local_7e0,ZEXT416((uint)fVar133));
              auVar85 = vfnmadd231ss_avx512f(auVar77,local_7e0,auVar78);
              auVar79 = vpermilps_avx(local_630,0xff);
              fVar134 = fVar134 - auVar79._0_4_;
              auVar79 = vshufps_avx(auVar80,auVar80,0xff);
              auVar77 = vfmsub213ss_fma(auVar83,auVar86,auVar79);
              fVar212 = auVar85._0_4_ * auVar86._0_4_;
              auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar77._0_4_)),
                                        ZEXT416((uint)fVar133),ZEXT416((uint)fVar212));
              fVar229 = auVar86._0_4_;
              auVar210._0_4_ = fVar212 / fVar229;
              auVar210._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar204._0_4_ = auVar77._0_4_ / fVar229;
              auVar204._4_12_ = auVar77._4_12_;
              auVar77 = vmulss_avx512f(local_7e0,auVar210);
              auVar86 = vmulss_avx512f(local_7e0,auVar204);
              fVar133 = fVar134 * (fVar133 / fVar229) - auVar86._0_4_;
              auVar200 = ZEXT464((uint)fVar133);
              fVar212 = local_820._0_4_ - (auVar77._0_4_ - fVar134 * (auVar78._0_4_ / fVar229));
              uVar226 = 0;
              uVar227 = 0;
              uVar228 = 0;
              fVar133 = (float)local_840._0_4_ - fVar133;
              uVar231 = 0;
              uVar232 = 0;
              uVar233 = 0;
              auVar91._0_16_ = vandps_avx512vl(local_7e0,auVar222);
              auVar91._16_16_ = auVar81;
              if (auVar84._0_4_ <= auVar91._0_4_) {
                bVar6 = false;
                auVar237 = ZEXT864(0) << 0x20;
              }
              else {
                auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ + auVar82._0_4_)),local_6a0,
                                          ZEXT416(0x36000000));
                auVar78 = vandps_avx(auVar222,ZEXT416((uint)fVar134));
                auVar57._12_4_ = 0;
                auVar57._0_12_ = ZEXT812(0);
                auVar237 = ZEXT1264(ZEXT812(0)) << 0x20;
                if (auVar77._0_4_ <= auVar78._0_4_) {
                  bVar6 = false;
                }
                else {
                  fVar133 = fVar133 + (float)local_690._0_4_;
                  uVar231 = 0;
                  uVar232 = 0;
                  uVar233 = 0;
                  bVar6 = true;
                  if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar133) {
                    fVar229 = (ray->super_RayK<1>).tfar;
                    auVar200 = ZEXT464((uint)fVar229);
                    if (((fVar133 <= fVar229) && (0.0 <= fVar212)) && (fVar212 <= 1.0)) {
                      auVar91._0_16_ =
                           vrsqrt14ss_avx512f(auVar57 << 0x20,ZEXT416((uint)local_720._0_4_));
                      fVar134 = auVar91._0_4_;
                      pGVar4 = (context->scene->geometries).items[local_888].ptr;
                      if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar134 = fVar134 * 1.5 +
                                  local_720._0_4_ * -0.5 * fVar134 * fVar134 * fVar134;
                        auVar167._0_4_ = local_700._0_4_ * fVar134;
                        auVar167._4_4_ = local_700._4_4_ * fVar134;
                        auVar167._8_4_ = local_700._8_4_ * fVar134;
                        auVar167._12_4_ = local_700._12_4_ * fVar134;
                        auVar81 = vfmadd213ps_fma(auVar79,auVar167,auVar80);
                        auVar78 = vshufps_avx(auVar167,auVar167,0xc9);
                        auVar79 = vshufps_avx(auVar80,auVar80,0xc9);
                        auVar168._0_4_ = auVar167._0_4_ * auVar79._0_4_;
                        auVar168._4_4_ = auVar167._4_4_ * auVar79._4_4_;
                        auVar168._8_4_ = auVar167._8_4_ * auVar79._8_4_;
                        auVar168._12_4_ = auVar167._12_4_ * auVar79._12_4_;
                        auVar80 = vfmsub231ps_fma(auVar168,auVar80,auVar78);
                        auVar78 = vshufps_avx(auVar80,auVar80,0xc9);
                        auVar79 = vshufps_avx(auVar81,auVar81,0xc9);
                        auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                        auVar140._0_4_ = auVar81._0_4_ * auVar80._0_4_;
                        auVar140._4_4_ = auVar81._4_4_ * auVar80._4_4_;
                        auVar140._8_4_ = auVar81._8_4_ * auVar80._8_4_;
                        auVar140._12_4_ = auVar81._12_4_ * auVar80._12_4_;
                        auVar78 = vfmsub231ps_fma(auVar140,auVar78,auVar79);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar133;
                          auVar79 = vshufps_avx(auVar78,auVar78,0xe9);
                          uVar14 = vmovlps_avx(auVar79);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar14;
                          (ray->Ng).field_0.field_0.z = auVar78._0_4_;
                          ray->u = fVar212;
                          ray->v = 0.0;
                          ray->primID = (uint)local_848;
                          ray->geomID = (uint)local_888;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar79 = vshufps_avx(auVar78,auVar78,0xe9);
                          local_770 = vmovlps_avx(auVar79);
                          local_768 = auVar78._0_4_;
                          local_764 = fVar212;
                          local_760 = 0;
                          local_75c = (uint)local_848;
                          local_758 = (uint)local_888;
                          local_754 = context->user->instID[0];
                          local_750 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar133;
                          local_88c = -1;
                          local_7c0.valid = &local_88c;
                          local_7c0.geometryUserPtr = pGVar4->userPtr;
                          local_7c0.context = context->user;
                          local_7c0.ray = (RTCRayN *)ray;
                          local_7c0.hit = (RTCHitN *)&local_770;
                          local_7c0.N = 1;
                          local_820._0_16_ = ZEXT416((uint)fVar212);
                          local_840._0_16_ = ZEXT416((uint)fVar133);
                          local_880._0_4_ = fVar229;
                          if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01ddf03d:
                            p_Var5 = context->args->filter;
                            if (p_Var5 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                                auVar224 = ZEXT1664(auVar224._0_16_);
                                (*p_Var5)(&local_7c0);
                                auVar200 = ZEXT464((uint)local_880._0_4_);
                                auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
                                fVar212 = (float)local_820._0_4_;
                                uVar226 = local_820._4_4_;
                                uVar227 = local_820._8_4_;
                                uVar228 = local_820._12_4_;
                                fVar133 = (float)local_840._0_4_;
                                uVar231 = local_840._4_4_;
                                uVar232 = local_840._8_4_;
                                uVar233 = local_840._12_4_;
                              }
                              if (*local_7c0.valid == 0) goto LAB_01ddf0ed;
                            }
                            (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_7c0.hit;
                            (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_7c0.hit + 4);
                            (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_7c0.hit + 8);
                            *(float *)((long)local_7c0.ray + 0x3c) = *(float *)(local_7c0.hit + 0xc)
                            ;
                            *(float *)((long)local_7c0.ray + 0x40) =
                                 *(float *)(local_7c0.hit + 0x10);
                            *(float *)((long)local_7c0.ray + 0x44) =
                                 *(float *)(local_7c0.hit + 0x14);
                            *(float *)((long)local_7c0.ray + 0x48) =
                                 *(float *)(local_7c0.hit + 0x18);
                            *(float *)((long)local_7c0.ray + 0x4c) =
                                 *(float *)(local_7c0.hit + 0x1c);
                            *(float *)((long)local_7c0.ray + 0x50) =
                                 *(float *)(local_7c0.hit + 0x20);
                          }
                          else {
                            auVar224 = ZEXT1664(auVar222);
                            (*pGVar4->intersectionFilterN)(&local_7c0);
                            auVar200 = ZEXT464((uint)local_880._0_4_);
                            auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
                            fVar212 = (float)local_820._0_4_;
                            uVar226 = local_820._4_4_;
                            uVar227 = local_820._8_4_;
                            uVar228 = local_820._12_4_;
                            fVar133 = (float)local_840._0_4_;
                            uVar231 = local_840._4_4_;
                            uVar232 = local_840._8_4_;
                            uVar233 = local_840._12_4_;
                            if (*local_7c0.valid != 0) goto LAB_01ddf03d;
LAB_01ddf0ed:
                            (ray->super_RayK<1>).tfar = auVar200._0_4_;
                          }
                        }
                      }
                    }
                  }
                }
              }
              bVar74 = lVar73 != 0;
              lVar73 = lVar73 + -1;
            } while ((!bVar6) && (bVar74));
            auVar63._4_4_ = fStack_4fc;
            auVar63._0_4_ = local_500;
            auVar63._8_4_ = fStack_4f8;
            auVar63._12_4_ = fStack_4f4;
            auVar63._16_4_ = fStack_4f0;
            auVar63._20_4_ = fStack_4ec;
            auVar63._24_4_ = fStack_4e8;
            auVar63._28_4_ = fStack_4e4;
            fVar133 = (ray->super_RayK<1>).tfar;
            auVar37._4_4_ = fVar133;
            auVar37._0_4_ = fVar133;
            auVar37._8_4_ = fVar133;
            auVar37._12_4_ = fVar133;
            auVar37._16_4_ = fVar133;
            auVar37._20_4_ = fVar133;
            auVar37._24_4_ = fVar133;
            auVar37._28_4_ = fVar133;
            uVar14 = vcmpps_avx512vl(auVar63,auVar37,2);
            bVar71 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar71 & (byte)uVar14;
          } while (bVar71 != 0);
        }
        uVar15 = vpcmpd_avx512vl(local_4a0,_local_580,1);
        uVar16 = vpcmpd_avx512vl(local_4a0,local_3e0,1);
        auVar172._0_4_ = (float)local_6e0._0_4_ + (float)local_460._0_4_;
        auVar172._4_4_ = (float)local_6e0._4_4_ + (float)local_460._4_4_;
        auVar172._8_4_ = fStack_6d8 + fStack_458;
        auVar172._12_4_ = fStack_6d4 + fStack_454;
        auVar172._16_4_ = fStack_6d0 + fStack_450;
        auVar172._20_4_ = fStack_6cc + fStack_44c;
        auVar172._24_4_ = fStack_6c8 + fStack_448;
        auVar172._28_4_ = fStack_6c4 + fStack_444;
        fVar206 = (ray->super_RayK<1>).tfar;
        auVar188._4_4_ = fVar206;
        auVar188._0_4_ = fVar206;
        auVar188._8_4_ = fVar206;
        auVar188._12_4_ = fVar206;
        auVar188._16_4_ = fVar206;
        auVar188._20_4_ = fVar206;
        auVar188._24_4_ = fVar206;
        auVar188._28_4_ = fVar206;
        uVar14 = vcmpps_avx512vl(auVar172,auVar188,2);
        bVar71 = (byte)local_788 & (byte)uVar16 & (byte)uVar14;
        auVar192._0_4_ = (float)local_6e0._0_4_ + (float)local_420._0_4_;
        auVar192._4_4_ = (float)local_6e0._4_4_ + (float)local_420._4_4_;
        auVar192._8_4_ = fStack_6d8 + fStack_418;
        auVar192._12_4_ = fStack_6d4 + fStack_414;
        auVar192._16_4_ = fStack_6d0 + fStack_410;
        auVar192._20_4_ = fStack_6cc + fStack_40c;
        auVar192._24_4_ = fStack_6c8 + fStack_408;
        auVar192._28_4_ = fStack_6c4 + fStack_404;
        uVar14 = vcmpps_avx512vl(auVar192,auVar188,2);
        bVar67 = bVar67 & (byte)uVar15 & (byte)uVar14 | bVar71;
        prim = local_738;
        if (bVar67 != 0) {
          uVar75 = local_7c8 & 0xffffffff;
          abStack_180[uVar75 * 0x60] = bVar67;
          auVar91._0_4_ =
               (uint)(bVar71 & 1) * local_460._0_4_ | (uint)!(bool)(bVar71 & 1) * local_420._0_4_;
          bVar6 = (bool)(bVar71 >> 1 & 1);
          auVar91._4_4_ = (uint)bVar6 * local_460._4_4_ | (uint)!bVar6 * local_420._4_4_;
          bVar6 = (bool)(bVar71 >> 2 & 1);
          auVar91._8_4_ = (uint)bVar6 * (int)fStack_458 | (uint)!bVar6 * (int)fStack_418;
          bVar6 = (bool)(bVar71 >> 3 & 1);
          auVar91._12_4_ = (uint)bVar6 * (int)fStack_454 | (uint)!bVar6 * (int)fStack_414;
          bVar6 = (bool)(bVar71 >> 4 & 1);
          auVar91._16_4_ = (uint)bVar6 * (int)fStack_450 | (uint)!bVar6 * (int)fStack_410;
          bVar6 = (bool)(bVar71 >> 5 & 1);
          auVar91._20_4_ = (uint)bVar6 * (int)fStack_44c | (uint)!bVar6 * (int)fStack_40c;
          bVar6 = (bool)(bVar71 >> 6 & 1);
          auVar91._24_4_ = (uint)bVar6 * (int)fStack_448 | (uint)!bVar6 * (int)fStack_408;
          auVar91._28_4_ =
               (uint)(bVar71 >> 7) * (int)fStack_444 | (uint)!(bool)(bVar71 >> 7) * (int)fStack_404;
          *(undefined1 (*) [32])(auStack_160 + uVar75 * 0x60) = auVar91;
          uVar14 = vmovlps_avx(local_780);
          *(undefined8 *)(afStack_140 + uVar75 * 0x18) = uVar14;
          auStack_138[uVar75 * 0x18] = (int)local_730 + 1;
          local_7c8 = (ulong)((int)local_7c8 + 1);
        }
      }
    }
    auVar193 = ZEXT1664(local_780);
    fVar206 = (ray->super_RayK<1>).tfar;
    auVar146._4_4_ = fVar206;
    auVar146._0_4_ = fVar206;
    auVar146._8_4_ = fVar206;
    auVar146._12_4_ = fVar206;
    auVar146._16_4_ = fVar206;
    auVar146._20_4_ = fVar206;
    auVar146._24_4_ = fVar206;
    auVar146._28_4_ = fVar206;
    local_7c8 = local_7c8 & 0xffffffff;
    do {
      if ((int)local_7c8 == 0) {
        fVar206 = (ray->super_RayK<1>).tfar;
        auVar38._4_4_ = fVar206;
        auVar38._0_4_ = fVar206;
        auVar38._8_4_ = fVar206;
        auVar38._12_4_ = fVar206;
        auVar38._16_4_ = fVar206;
        auVar38._20_4_ = fVar206;
        auVar38._24_4_ = fVar206;
        auVar38._28_4_ = fVar206;
        uVar14 = vcmpps_avx512vl(local_3c0,auVar38,2);
        uVar76 = (uint)local_728 & (uint)uVar14;
        local_728 = (ulong)uVar76;
        if (uVar76 == 0) {
          return;
        }
        goto LAB_01ddceb6;
      }
      uVar75 = (ulong)((int)local_7c8 - 1);
      lVar73 = uVar75 * 0x60;
      auVar93 = *(undefined1 (*) [32])(auStack_160 + lVar73);
      auVar119._0_4_ = (float)local_6e0._0_4_ + auVar93._0_4_;
      auVar119._4_4_ = (float)local_6e0._4_4_ + auVar93._4_4_;
      auVar119._8_4_ = fStack_6d8 + auVar93._8_4_;
      auVar119._12_4_ = fStack_6d4 + auVar93._12_4_;
      auVar119._16_4_ = fStack_6d0 + auVar93._16_4_;
      auVar119._20_4_ = fStack_6cc + auVar93._20_4_;
      auVar119._24_4_ = fStack_6c8 + auVar93._24_4_;
      auVar119._28_4_ = fStack_6c4 + auVar93._28_4_;
      uVar14 = vcmpps_avx512vl(auVar119,auVar146,2);
      uVar76 = (uint)uVar14 & (uint)abStack_180[lVar73];
      bVar67 = (byte)uVar76;
      if (uVar76 != 0) {
        auVar186._8_4_ = 0x7f800000;
        auVar186._0_8_ = 0x7f8000007f800000;
        auVar186._12_4_ = 0x7f800000;
        auVar186._16_4_ = 0x7f800000;
        auVar186._20_4_ = 0x7f800000;
        auVar186._24_4_ = 0x7f800000;
        auVar186._28_4_ = 0x7f800000;
        auVar94 = vblendmps_avx512vl(auVar186,auVar93);
        auVar91._0_4_ =
             (uint)(bVar67 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar67 & 1) * (int)auVar93._0_4_;
        bVar6 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar91._4_4_ = (uint)bVar6 * auVar94._4_4_ | (uint)!bVar6 * (int)auVar93._4_4_;
        bVar6 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar91._8_4_ = (uint)bVar6 * auVar94._8_4_ | (uint)!bVar6 * (int)auVar93._8_4_;
        bVar6 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar91._12_4_ = (uint)bVar6 * auVar94._12_4_ | (uint)!bVar6 * (int)auVar93._12_4_;
        bVar6 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar91._16_4_ = (uint)bVar6 * auVar94._16_4_ | (uint)!bVar6 * (int)auVar93._16_4_;
        bVar6 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar91._20_4_ = (uint)bVar6 * auVar94._20_4_ | (uint)!bVar6 * (int)auVar93._20_4_;
        bVar6 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar91._24_4_ = (uint)bVar6 * auVar94._24_4_ | (uint)!bVar6 * (int)auVar93._24_4_;
        auVar91._28_4_ =
             (uVar76 >> 7) * auVar94._28_4_ | (uint)!SUB41(uVar76 >> 7,0) * (int)auVar93._28_4_;
        auVar93 = vshufps_avx(auVar91,auVar91,0xb1);
        auVar93 = vminps_avx(auVar91,auVar93);
        auVar94 = vshufpd_avx(auVar93,auVar93,5);
        auVar93 = vminps_avx(auVar93,auVar94);
        auVar94 = vpermpd_avx2(auVar93,0x4e);
        auVar93 = vminps_avx(auVar93,auVar94);
        uVar14 = vcmpps_avx512vl(auVar91,auVar93,0);
        bVar71 = (byte)uVar14 & bVar67;
        if (bVar71 != 0) {
          uVar76 = (uint)bVar71;
        }
        fVar206 = afStack_140[uVar75 * 0x18 + 1];
        uVar126 = 0;
        for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
          uVar126 = uVar126 + 1;
        }
        local_730 = (ulong)auStack_138[uVar75 * 0x18];
        bVar71 = ~('\x01' << ((byte)uVar126 & 0x1f)) & bVar67;
        abStack_180[lVar73] = bVar71;
        uVar72 = uVar75;
        if (bVar71 != 0) {
          uVar72 = local_7c8;
        }
        fVar133 = afStack_140[uVar75 * 0x18];
        auVar119._4_4_ = fVar133;
        auVar119._0_4_ = fVar133;
        auVar119._8_4_ = fVar133;
        auVar119._12_4_ = fVar133;
        auVar119._16_4_ = fVar133;
        auVar119._20_4_ = fVar133;
        auVar119._24_4_ = fVar133;
        auVar119._28_4_ = fVar133;
        fVar206 = fVar206 - fVar133;
        auVar171._4_4_ = fVar206;
        auVar171._0_4_ = fVar206;
        auVar171._8_4_ = fVar206;
        auVar171._12_4_ = fVar206;
        auVar171._16_4_ = fVar206;
        auVar171._20_4_ = fVar206;
        auVar171._24_4_ = fVar206;
        auVar171._28_4_ = fVar206;
        auVar78 = vfmadd132ps_fma(auVar171,auVar119,_DAT_02020f20);
        _local_460 = ZEXT1632(auVar78);
        auVar193 = ZEXT864(*(ulong *)(local_460 + (ulong)uVar126 * 4));
        uVar75 = uVar72;
      }
      local_7c8 = uVar75;
    } while (bVar67 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }